

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1089::run(TestCase1089 *this)

{
  StructDataBitCount *this_00;
  Builder reader;
  Builder root_00;
  Builder reader_00;
  Builder reader_01;
  Builder reader_02;
  Builder root_01;
  Builder reader_03;
  Builder reader_04;
  Builder reader_05;
  Builder root_02;
  Builder reader_06;
  Builder reader_07;
  Builder reader_08;
  Builder reader_09;
  Builder root_03;
  Builder reader_10;
  Builder reader_11;
  Builder reader_12;
  Builder reader_13;
  Builder reader_14;
  Builder root_04;
  Builder reader_15;
  Builder reader_16;
  Builder root_05;
  Builder reader_17;
  Builder reader_18;
  Builder reader_19;
  Builder reader_20;
  Builder reader_21;
  Builder reader_22;
  Builder root_06;
  Builder reader_23;
  Builder reader_24;
  Builder reader_25;
  Builder reader_26;
  Builder reader_27;
  Builder reader_28;
  Builder reader_29;
  Builder reader_30;
  Reader reader_31;
  Reader reader_32;
  Reader reader_33;
  Reader reader_34;
  Reader reader_35;
  Reader reader_36;
  Reader reader_37;
  Reader reader_38;
  Reader reader_39;
  Reader reader_40;
  Reader reader_41;
  Reader reader_42;
  Reader reader_43;
  Reader reader_44;
  Reader reader_45;
  initializer_list<unsigned_int> list;
  initializer_list<capnp::Text::Reader> list_00;
  initializer_list<capnp::Text::Reader> expected;
  initializer_list<capnp::Void> list_01;
  initializer_list<unsigned_long> expected_00;
  initializer_list<unsigned_int> expected_01;
  initializer_list<unsigned_short> expected_02;
  initializer_list<capnp::Void> list_02;
  initializer_list<unsigned_long> expected_03;
  initializer_list<unsigned_int> expected_04;
  initializer_list<unsigned_short> expected_05;
  initializer_list<unsigned_char> expected_06;
  initializer_list<unsigned_short> expected_07;
  initializer_list<unsigned_short> expected_08;
  initializer_list<unsigned_short> list_03;
  initializer_list<capnp::Text::Reader> expected_09;
  initializer_list<unsigned_long> expected_10;
  initializer_list<unsigned_int> expected_11;
  initializer_list<unsigned_short> expected_12;
  initializer_list<unsigned_char> expected_13;
  initializer_list<capnp::Void> expected_14;
  initializer_list<capnp::Text::Reader> expected_15;
  initializer_list<capnp::Text::Reader> expected_16;
  initializer_list<capnp::Text::Reader> expected_17;
  initializer_list<capnp::Void> expected_18;
  initializer_list<capnp::Text::Reader> list_04;
  initializer_list<unsigned_long> expected_19;
  initializer_list<unsigned_long> expected_20;
  initializer_list<unsigned_long> expected_21;
  initializer_list<unsigned_int> expected_22;
  initializer_list<unsigned_short> expected_23;
  initializer_list<unsigned_char> expected_24;
  initializer_list<capnp::Void> expected_25;
  initializer_list<unsigned_long> list_05;
  initializer_list<unsigned_int> expected_26;
  initializer_list<unsigned_int> expected_27;
  initializer_list<unsigned_int> expected_28;
  initializer_list<unsigned_short> expected_29;
  initializer_list<unsigned_char> expected_30;
  initializer_list<capnp::Void> expected_31;
  initializer_list<unsigned_int> list_06;
  initializer_list<unsigned_short> expected_32;
  initializer_list<unsigned_short> expected_33;
  initializer_list<unsigned_short> expected_34;
  initializer_list<unsigned_char> expected_35;
  initializer_list<capnp::Void> expected_36;
  initializer_list<unsigned_short> list_07;
  initializer_list<unsigned_char> expected_37;
  initializer_list<unsigned_char> expected_38;
  initializer_list<unsigned_char> expected_39;
  initializer_list<capnp::Void> expected_40;
  initializer_list<unsigned_char> list_08;
  initializer_list<bool> expected_41;
  initializer_list<bool> expected_42;
  initializer_list<bool> list_09;
  initializer_list<capnp::Void> expected_43;
  initializer_list<capnp::Void> list_10;
  bool bVar1;
  uint16_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  Type *func;
  Type *extraout_RDX;
  Type *extraout_RDX_00;
  Type *func_00;
  Type *extraout_RDX_01;
  Type *extraout_RDX_02;
  Type *extraout_RDX_03;
  Type *func_01;
  Type *extraout_RDX_04;
  Type *extraout_RDX_05;
  Type *extraout_RDX_06;
  Type *func_02;
  Type *extraout_RDX_07;
  Type *extraout_RDX_08;
  Type *extraout_RDX_09;
  Type *func_03;
  Type *extraout_RDX_10;
  Type *extraout_RDX_11;
  Type *extraout_RDX_12;
  Type *func_04;
  Type *extraout_RDX_13;
  Type *func_05;
  Type *func_06;
  Type *extraout_RDX_14;
  Type *extraout_RDX_15;
  Type *func_07;
  Type *extraout_RDX_16;
  Type *extraout_RDX_17;
  Type *extraout_RDX_18;
  Type *func_08;
  Type *extraout_RDX_19;
  Type *extraout_RDX_20;
  Type *extraout_RDX_21;
  Type *func_09;
  Type *extraout_RDX_22;
  Type *extraout_RDX_23;
  Type *extraout_RDX_24;
  Type *func_10;
  Type *extraout_RDX_25;
  Type *func_11;
  Type *func_12;
  Type *func_13;
  Type *extraout_RDX_26;
  Type *extraout_RDX_27;
  Type *func_14;
  Type *extraout_RDX_28;
  Type *extraout_RDX_29;
  Type *extraout_RDX_30;
  Type *func_15;
  Type *extraout_RDX_31;
  Type *extraout_RDX_32;
  Type *extraout_RDX_33;
  Type *func_16;
  Type *extraout_RDX_34;
  Type *func_17;
  Type *func_18;
  Type *extraout_RDX_35;
  Type *extraout_RDX_36;
  Type *func_19;
  Type *extraout_RDX_37;
  Type *extraout_RDX_38;
  Type *extraout_RDX_39;
  Type *func_20;
  Type *extraout_RDX_40;
  Type *func_21;
  Type *func_22;
  Type *extraout_RDX_41;
  Type *extraout_RDX_42;
  Type *func_23;
  Type *extraout_RDX_43;
  Type *func_24;
  Type *func_25;
  Type *func_26;
  Type *extraout_RDX_44;
  Type *extraout_RDX_45;
  Type *func_27;
  Type *extraout_RDX_46;
  Type *extraout_RDX_47;
  Type *extraout_RDX_48;
  Type *func_28;
  Type *extraout_RDX_49;
  Type *extraout_RDX_50;
  Type *extraout_RDX_51;
  Type *func_29;
  Type *extraout_RDX_52;
  Type *extraout_RDX_53;
  Type *extraout_RDX_54;
  Type *func_30;
  Type *extraout_RDX_55;
  Type *func_31;
  Type *func_32;
  Type *func_33;
  Type *func_34;
  Type *func_35;
  Type *func_36;
  Type *extraout_RDX_56;
  Type *extraout_RDX_57;
  Type *func_37;
  Type *extraout_RDX_58;
  Type *extraout_RDX_59;
  Type *extraout_RDX_60;
  Type *func_38;
  Type *extraout_RDX_61;
  Type *extraout_RDX_62;
  Type *extraout_RDX_63;
  Type *func_39;
  Type *extraout_RDX_64;
  Type *func_40;
  Type *func_41;
  char *pcVar5;
  initializer_list<long> expectedData;
  initializer_list<long> expectedData_00;
  initializer_list<long> expectedData_01;
  initializer_list<long> expectedData_02;
  initializer_list<long> expectedData_03;
  initializer_list<long> expectedData_04;
  initializer_list<long> expectedData_05;
  initializer_list<long> expectedData_06;
  initializer_list<long> expectedData_07;
  initializer_list<capnp::Text::Reader> expectedPointers;
  initializer_list<capnp::Text::Reader> expectedPointers_00;
  initializer_list<capnp::Text::Reader> expectedPointers_01;
  initializer_list<capnp::Text::Reader> expectedPointers_02;
  initializer_list<capnp::Text::Reader> expectedPointers_03;
  initializer_list<capnp::Text::Reader> expectedPointers_04;
  initializer_list<capnp::Text::Reader> expectedPointers_05;
  initializer_list<capnp::Text::Reader> expectedPointers_06;
  initializer_list<capnp::Text::Reader> expectedPointers_07;
  bool local_6531;
  undefined1 *puStack_6530;
  bool _kj_shouldLog_54;
  Maybe<kj::Exception> local_6528;
  uint local_63c8 [4];
  iterator local_63b8;
  undefined8 local_63b0;
  Builder local_63a8;
  bool local_6389;
  undefined1 *puStack_6388;
  bool _kj_shouldLog_53;
  Maybe<kj::Exception> local_6380;
  Reader local_6220;
  Reader local_6210;
  Reader local_6200;
  Reader local_61f0;
  iterator local_61e0;
  undefined8 local_61d8;
  Builder local_61d0;
  Reader local_61b8;
  Reader local_61a8;
  Reader local_6198;
  Reader local_6188;
  iterator local_6178;
  undefined8 local_6170;
  Builder local_6168;
  BuilderFor<capnp::List<capnp::Text,_(capnp::Kind)1>_> local_6150;
  bool local_6121;
  undefined1 *puStack_6120;
  bool _kj_shouldLog_52;
  Maybe<kj::Exception> local_6118;
  bool local_5fb1;
  undefined1 *puStack_5fb0;
  bool _kj_shouldLog_51;
  Maybe<kj::Exception> local_5fa8;
  bool local_5e41;
  undefined1 *puStack_5e40;
  bool _kj_shouldLog_50;
  Maybe<kj::Exception> local_5e38;
  bool local_5cd1;
  undefined1 *puStack_5cd0;
  bool _kj_shouldLog_49;
  Maybe<kj::Exception> local_5cc8;
  ArrayPtr<const_char> local_5b68;
  Builder local_5b58;
  ArrayPtr<const_char> local_5b30;
  Builder local_5b20;
  ArrayPtr<const_char> local_5af8;
  Builder local_5ae8;
  ArrayPtr<const_char> local_5ac0;
  Builder local_5ab0;
  Builder local_5a88;
  Builder local_5a60;
  bool local_5a41;
  undefined1 local_5a40 [7];
  bool _kj_shouldLog_48;
  Builder local_5a18;
  Builder local_5a00;
  Builder local_59d8;
  bool local_59b9;
  undefined1 local_59b8 [7];
  bool _kj_shouldLog_47;
  Builder local_5990;
  Builder local_5978;
  Builder local_5950;
  bool local_5931;
  undefined1 local_5930 [7];
  bool _kj_shouldLog_46;
  Builder local_5908;
  Builder local_58f0;
  Builder local_58c8;
  bool local_58a9;
  undefined1 local_58a8 [7];
  bool _kj_shouldLog_45;
  Builder local_5880;
  uint local_5868;
  uint local_5864;
  Fault local_5860;
  Fault f_2;
  undefined1 local_5840 [8];
  BuilderFor<capnp::List<capnproto_test::capnp::test::TestLists::StructP,_(capnp::Kind)3>_> l_3;
  Builder local_5800;
  bool local_57e1;
  undefined1 *puStack_57e0;
  bool _kj_shouldLog_44;
  Maybe<kj::Exception> local_57d8;
  unsigned_long local_5678 [5];
  iterator local_5650;
  undefined8 local_5648;
  Builder local_5640;
  BuilderFor<capnp::List<unsigned_long,_(capnp::Kind)0>_> local_5628;
  uint local_5600 [4];
  iterator local_55f0;
  undefined8 local_55e8;
  Builder local_55e0;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> local_55c8;
  unsigned_short local_55a0 [4];
  iterator local_5598;
  undefined8 local_5590;
  Builder local_5588;
  BuilderFor<capnp::List<unsigned_short,_(capnp::Kind)0>_> local_5570;
  bool local_5541;
  undefined1 *puStack_5540;
  bool _kj_shouldLog_43;
  Maybe<kj::Exception> local_5538;
  Builder local_53d8;
  Builder local_53b0;
  Builder local_5388;
  Builder local_5360;
  Builder local_5338;
  uint16_t local_530a;
  uint local_5308;
  bool local_5301;
  undefined1 local_5300 [7];
  bool _kj_shouldLog_42;
  Builder local_52d8;
  uint16_t local_52aa;
  uint local_52a8;
  bool local_52a1;
  undefined1 local_52a0 [7];
  bool _kj_shouldLog_41;
  Builder local_5278;
  uint16_t local_524a;
  uint local_5248;
  bool local_5241;
  undefined1 local_5240 [7];
  bool _kj_shouldLog_40;
  Builder local_5218;
  uint16_t local_51ea;
  uint local_51e8;
  bool local_51e1;
  undefined1 local_51e0 [7];
  bool _kj_shouldLog_39;
  uint local_51b8;
  uint local_51b4;
  Fault local_51b0;
  Fault f_1;
  undefined1 local_5190 [8];
  BuilderFor<capnp::List<capnproto_test::capnp::test::TestLists::Struct16,_(capnp::Kind)3>_> l_2;
  Builder local_5150;
  bool local_5131;
  undefined1 *puStack_5130;
  bool _kj_shouldLog_38;
  Maybe<kj::Exception> local_5128;
  unsigned_long local_4fc8 [5];
  iterator local_4fa0;
  undefined8 local_4f98;
  Builder local_4f90;
  BuilderFor<capnp::List<unsigned_long,_(capnp::Kind)0>_> local_4f78;
  uint local_4f50 [4];
  iterator local_4f40;
  undefined8 local_4f38;
  Builder local_4f30;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> local_4f18;
  unsigned_short local_4ef0 [4];
  iterator local_4ee8;
  undefined8 local_4ee0;
  Builder local_4ed8;
  BuilderFor<capnp::List<unsigned_short,_(capnp::Kind)0>_> local_4ec0;
  uchar local_4e94 [4];
  iterator local_4e90;
  undefined8 local_4e88;
  Builder local_4e80;
  BuilderFor<capnp::List<unsigned_char,_(capnp::Kind)0>_> local_4e68;
  bool local_4e39;
  undefined1 *puStack_4e38;
  bool _kj_shouldLog_37;
  Maybe<kj::Exception> local_4e30;
  Builder local_4cd0;
  Builder local_4ca8;
  Builder local_4c80;
  Builder local_4c58;
  Builder local_4c30;
  uint32_t local_4c04;
  uint local_4c00;
  bool local_4bf9;
  undefined1 local_4bf8 [7];
  bool _kj_shouldLog_36;
  Builder local_4bd0;
  uint32_t local_4ba4;
  uint local_4ba0;
  bool local_4b99;
  undefined1 local_4b98 [7];
  bool _kj_shouldLog_35;
  Builder local_4b70;
  uint32_t local_4b44;
  uint local_4b40;
  bool local_4b39;
  undefined1 local_4b38 [7];
  bool _kj_shouldLog_34;
  Builder local_4b10;
  uint32_t local_4ae4;
  uint local_4ae0;
  bool local_4ad9;
  undefined1 local_4ad8 [7];
  bool _kj_shouldLog_33;
  uint local_4ab0;
  uint local_4aac;
  Fault local_4aa8;
  Fault f;
  Builder local_4a50;
  undefined1 local_4a38 [8];
  BuilderFor<capnp::List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>_> l_1;
  Reader local_49c8;
  Reader local_4998;
  undefined1 auStack_4978 [8];
  ReaderFor<capnp::List<unsigned_short,_(capnp::Kind)0>_> orig_7;
  Builder local_4930;
  Reader local_4918;
  Reader local_4908;
  Reader local_48f8;
  Reader *local_48e8;
  undefined8 local_48e0;
  undefined8 local_48d8;
  undefined8 uStack_48d0;
  undefined8 local_48c8;
  _ *local_48b8;
  iterator local_48b0;
  SegmentReader *local_48a8;
  SegmentReader *pSStack_48a0;
  CapTableReader *local_4898;
  byte *pbStack_4890;
  ListElementCount local_4888;
  BitsPerElementN<23> BStack_4884;
  StructDataBitCount SStack_4880;
  StructPointerCount SStack_487c;
  ElementSize EStack_487a;
  undefined1 uStack_4879;
  Reader local_4878;
  Reader local_4868;
  Reader local_4858;
  Reader *local_4848;
  undefined8 local_4840;
  undefined8 local_4838;
  undefined8 uStack_4830;
  undefined8 local_4828;
  anon_unknown_0 *local_4818;
  iterator local_4810;
  SegmentBuilder *local_4808;
  SegmentBuilder *pSStack_4800;
  CapTableBuilder *local_47f8;
  void *pvStack_47f0;
  WirePointer *local_47e8;
  Reader local_47d8;
  Reader local_47c8;
  Reader local_47b8;
  Reader *local_47a8;
  undefined8 local_47a0;
  undefined8 local_4798;
  undefined8 uStack_4790;
  undefined8 local_4788;
  _ *local_4778;
  iterator local_4770;
  SegmentReader *local_4768;
  SegmentReader *pSStack_4760;
  CapTableReader *local_4758;
  byte *pbStack_4750;
  ListElementCount local_4748;
  BitsPerElementN<23> BStack_4744;
  StructDataBitCount SStack_4740;
  StructPointerCount SStack_473c;
  ElementSize EStack_473a;
  undefined1 uStack_4739;
  Reader local_4738;
  Reader local_4728;
  Reader local_4718;
  iterator local_4708;
  undefined8 local_4700;
  Builder local_46f8;
  BuilderFor<capnp::List<capnp::Text,_(capnp::Kind)1>_> local_46e0;
  unsigned_long local_46b8 [3];
  iterator local_46a0;
  undefined8 local_4698;
  Builder local_4690;
  BuilderFor<capnp::List<unsigned_long,_(capnp::Kind)0>_> local_4678;
  uint local_464c [3];
  iterator local_4640;
  undefined8 local_4638;
  Builder local_4630;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> local_4618;
  unsigned_short local_45ee [3];
  iterator local_45e8;
  undefined8 local_45e0;
  Builder local_45d8;
  BuilderFor<capnp::List<unsigned_short,_(capnp::Kind)0>_> local_45c0;
  uchar local_4593 [3];
  iterator local_4590;
  undefined8 local_4588;
  Builder local_4580;
  BuilderFor<capnp::List<unsigned_char,_(capnp::Kind)0>_> local_4568;
  bool local_4539;
  undefined1 *puStack_4538;
  bool _kj_shouldLog_32;
  Maybe<kj::Exception> local_4530;
  Void local_43cb [3];
  iterator local_43c8;
  undefined8 local_43c0;
  Builder local_43b8;
  BuilderFor<capnp::List<capnp::Void,_(capnp::Kind)0>_> local_43a0;
  Reader local_4378;
  Reader local_4348;
  undefined1 auStack_4328 [8];
  ReaderFor<capnp::List<capnproto_test::capnp::test::TestOldVersion>_> orig_6;
  Builder local_42e8;
  ArrayPtr<const_char> local_42c0;
  Builder local_42b0;
  ArrayPtr<const_char> local_4288;
  Builder local_4278;
  Builder local_4250;
  Builder local_4228;
  Builder local_4200;
  Builder local_41d8;
  undefined1 local_41c0 [8];
  BuilderFor<capnp::List<capnproto_test::capnp::test::TestOldVersion>_> l;
  Reader local_4188;
  Reader local_4178;
  StructDataBitCount *local_4168;
  undefined8 local_4160;
  SegmentReader *local_4158;
  SegmentReader *pSStack_4150;
  CapTableReader *local_4148;
  byte *pbStack_4140;
  ListElementCount local_4138;
  BitsPerElementN<23> BStack_4134;
  StructDataBitCount SStack_4130;
  StructPointerCount SStack_412c;
  ElementSize EStack_412a;
  undefined1 uStack_4129;
  Reader local_4128;
  Reader local_4118;
  Reader local_4108;
  Reader *local_40f8;
  undefined8 local_40f0;
  undefined8 local_40e8;
  undefined8 uStack_40e0;
  undefined8 local_40d8;
  anon_unknown_0 *local_40c8;
  iterator local_40c0;
  SegmentBuilder *local_40b8;
  SegmentBuilder *pSStack_40b0;
  CapTableBuilder *local_40a8;
  void *pvStack_40a0;
  WirePointer *local_4098;
  Reader local_4088;
  Reader local_4078;
  Reader local_4068;
  iterator local_4058;
  undefined8 local_4050;
  SegmentReader *local_4048;
  SegmentReader *pSStack_4040;
  CapTableReader *local_4038;
  byte *pbStack_4030;
  ListElementCount local_4028;
  BitsPerElementN<23> BStack_4024;
  StructDataBitCount SStack_4020;
  StructPointerCount SStack_401c;
  ElementSize EStack_401a;
  undefined1 uStack_4019;
  Reader local_4018;
  Reader local_4008;
  Reader local_3ff8;
  iterator local_3fe8;
  undefined8 local_3fe0;
  Builder local_3fd8;
  BuilderFor<capnp::List<capnp::Text,_(capnp::Kind)1>_> local_3fc0;
  bool local_3f91;
  undefined1 *puStack_3f90;
  bool _kj_shouldLog_31;
  Maybe<kj::Exception> local_3f88;
  bool local_3e21;
  undefined1 *puStack_3e20;
  bool _kj_shouldLog_30;
  Maybe<kj::Exception> local_3e18;
  bool local_3cb1;
  undefined1 *puStack_3cb0;
  bool _kj_shouldLog_29;
  Maybe<kj::Exception> local_3ca8;
  bool local_3b41;
  undefined1 *puStack_3b40;
  bool _kj_shouldLog_28;
  Maybe<kj::Exception> local_3b38;
  bool local_39d1;
  undefined1 *puStack_39d0;
  bool _kj_shouldLog_27;
  Maybe<kj::Exception> local_39c8;
  Void local_3863 [3];
  iterator local_3860;
  undefined8 local_3858;
  Builder local_3850;
  BuilderFor<capnp::List<capnp::Void,_(capnp::Kind)0>_> local_3838;
  Reader local_3810;
  Reader local_37e0;
  undefined1 auStack_37c0 [8];
  ReaderFor<capnp::List<capnp::Text,_(capnp::Kind)1>_> orig_5;
  Reader local_3780;
  Reader local_3770;
  int *local_3760;
  undefined8 local_3758;
  Builder local_3750;
  unsigned_long local_3738 [2];
  iterator local_3728;
  undefined8 local_3720;
  SegmentReader *local_3718;
  SegmentReader *pSStack_3710;
  CapTableReader *local_3708;
  byte *pbStack_3700;
  ListElementCount local_36f8;
  BitsPerElementN<23> BStack_36f4;
  StructDataBitCount SStack_36f0;
  StructPointerCount SStack_36ec;
  ElementSize EStack_36ea;
  undefined1 uStack_36e9;
  Reader local_36e8;
  Reader local_36d8;
  Reader *local_36c8;
  undefined8 local_36c0;
  undefined8 local_36b8;
  undefined8 local_36b0;
  anon_unknown_0 *local_36a8;
  iterator local_36a0;
  SegmentBuilder *local_3698;
  SegmentBuilder *pSStack_3690;
  CapTableBuilder *local_3688;
  void *pvStack_3680;
  WirePointer *local_3678;
  unsigned_long local_3668 [2];
  iterator local_3658;
  undefined8 local_3650;
  SegmentReader *local_3648;
  SegmentReader *pSStack_3640;
  CapTableReader *local_3638;
  byte *pbStack_3630;
  ListElementCount local_3628;
  BitsPerElementN<23> BStack_3624;
  StructDataBitCount SStack_3620;
  StructPointerCount SStack_361c;
  ElementSize EStack_361a;
  undefined1 uStack_3619;
  bool local_3609;
  undefined1 *puStack_3608;
  bool _kj_shouldLog_26;
  Maybe<kj::Exception> local_3600;
  unsigned_long local_34a0 [2];
  iterator local_3490;
  undefined8 local_3488;
  Builder local_3480;
  BuilderFor<capnp::List<unsigned_long,_(capnp::Kind)0>_> local_3468;
  uint local_3440 [2];
  iterator local_3438;
  undefined8 local_3430;
  Builder local_3428;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> local_3410;
  unsigned_short local_33e4 [2];
  iterator local_33e0;
  undefined8 local_33d8;
  Builder local_33d0;
  BuilderFor<capnp::List<unsigned_short,_(capnp::Kind)0>_> local_33b8;
  uchar local_338a [2];
  iterator local_3388;
  undefined8 local_3380;
  Builder local_3378;
  BuilderFor<capnp::List<unsigned_char,_(capnp::Kind)0>_> local_3360;
  bool local_3331;
  undefined1 *puStack_3330;
  bool _kj_shouldLog_25;
  Maybe<kj::Exception> local_3328;
  Void local_31c2 [2];
  iterator local_31c0;
  undefined8 local_31b8;
  Builder local_31b0;
  BuilderFor<capnp::List<capnp::Void,_(capnp::Kind)0>_> local_3198;
  Reader local_3170;
  Reader local_3140;
  undefined1 auStack_3120 [8];
  ReaderFor<capnp::List<unsigned_long,_(capnp::Kind)0>_> orig_4;
  Builder local_30d0;
  uint local_30b8 [4];
  iterator local_30a8;
  undefined8 local_30a0;
  SegmentReader *local_3098;
  SegmentReader *pSStack_3090;
  CapTableReader *local_3088;
  byte *pbStack_3080;
  ListElementCount local_3078;
  BitsPerElementN<23> BStack_3074;
  StructDataBitCount SStack_3070;
  StructPointerCount SStack_306c;
  ElementSize EStack_306a;
  undefined1 uStack_3069;
  Reader local_3068;
  Reader local_3058;
  Reader local_3048;
  Reader local_3038;
  Reader *local_3028;
  undefined8 local_3020;
  undefined8 local_3018;
  undefined8 uStack_3010;
  undefined8 local_3008;
  undefined8 uStack_3000;
  anon_unknown_0 *local_2ff8;
  iterator local_2ff0;
  SegmentBuilder *local_2fe8;
  SegmentBuilder *pSStack_2fe0;
  CapTableBuilder *local_2fd8;
  void *pvStack_2fd0;
  WirePointer *local_2fc8;
  uint local_2fb8 [4];
  iterator local_2fa8;
  undefined8 local_2fa0;
  SegmentReader *local_2f98;
  SegmentReader *pSStack_2f90;
  CapTableReader *local_2f88;
  byte *pbStack_2f80;
  ListElementCount local_2f78;
  BitsPerElementN<23> BStack_2f74;
  StructDataBitCount SStack_2f70;
  StructPointerCount SStack_2f6c;
  ElementSize EStack_2f6a;
  undefined1 uStack_2f69;
  bool local_2f59;
  undefined1 *puStack_2f58;
  bool _kj_shouldLog_24;
  Maybe<kj::Exception> local_2f50;
  bool local_2de9;
  undefined1 *puStack_2de8;
  bool _kj_shouldLog_23;
  Maybe<kj::Exception> local_2de0;
  uint local_2c80 [4];
  iterator local_2c70;
  undefined8 local_2c68;
  Builder local_2c60;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> local_2c48;
  unsigned_short local_2c20 [4];
  iterator local_2c18;
  undefined8 local_2c10;
  Builder local_2c08;
  BuilderFor<capnp::List<unsigned_short,_(capnp::Kind)0>_> local_2bf0;
  uchar local_2bc4 [4];
  iterator local_2bc0;
  undefined8 local_2bb8;
  Builder local_2bb0;
  BuilderFor<capnp::List<unsigned_char,_(capnp::Kind)0>_> local_2b98;
  bool local_2b69;
  undefined1 *puStack_2b68;
  bool _kj_shouldLog_22;
  Maybe<kj::Exception> local_2b60;
  Void local_29fc [4];
  iterator local_29f8;
  undefined8 local_29f0;
  Builder local_29e8;
  BuilderFor<capnp::List<capnp::Void,_(capnp::Kind)0>_> local_29d0;
  Reader local_29a8;
  Reader local_2978;
  undefined1 auStack_2958 [8];
  ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> orig_3;
  Builder local_2908;
  unsigned_short local_28f0 [4];
  iterator local_28e8;
  undefined8 local_28e0;
  SegmentReader *local_28d8;
  SegmentReader *pSStack_28d0;
  CapTableReader *local_28c8;
  byte *pbStack_28c0;
  ListElementCount local_28b8;
  BitsPerElementN<23> BStack_28b4;
  StructDataBitCount SStack_28b0;
  StructPointerCount SStack_28ac;
  ElementSize EStack_28aa;
  undefined1 uStack_28a9;
  Reader local_28a8;
  Reader local_2898;
  Reader local_2888;
  Reader local_2878;
  Reader *local_2868;
  undefined8 local_2860;
  undefined8 local_2858;
  undefined8 uStack_2850;
  undefined8 local_2848;
  undefined8 uStack_2840;
  anon_unknown_0 *local_2838;
  iterator local_2830;
  SegmentBuilder *local_2828;
  SegmentBuilder *pSStack_2820;
  CapTableBuilder *local_2818;
  void *pvStack_2810;
  WirePointer *local_2808;
  unsigned_short local_2800 [4];
  iterator local_27f8;
  undefined8 local_27f0;
  SegmentReader *local_27e8;
  SegmentReader *pSStack_27e0;
  CapTableReader *local_27d8;
  byte *pbStack_27d0;
  ListElementCount local_27c8;
  BitsPerElementN<23> BStack_27c4;
  StructDataBitCount SStack_27c0;
  StructPointerCount SStack_27bc;
  ElementSize EStack_27ba;
  undefined1 uStack_27b9;
  bool local_27b1;
  undefined1 *puStack_27b0;
  bool _kj_shouldLog_21;
  Maybe<kj::Exception> local_27a8;
  bool local_2641;
  undefined1 *puStack_2640;
  bool _kj_shouldLog_20;
  Maybe<kj::Exception> local_2638;
  bool local_24d1;
  undefined1 *puStack_24d0;
  bool _kj_shouldLog_19;
  Maybe<kj::Exception> local_24c8;
  unsigned_short local_2368 [4];
  iterator local_2360;
  undefined8 local_2358;
  Builder local_2350;
  BuilderFor<capnp::List<unsigned_short,_(capnp::Kind)0>_> local_2338;
  uchar local_230c [4];
  iterator local_2308;
  undefined8 local_2300;
  Builder local_22f8;
  BuilderFor<capnp::List<unsigned_char,_(capnp::Kind)0>_> local_22e0;
  bool local_22b1;
  undefined1 *puStack_22b0;
  bool _kj_shouldLog_18;
  Maybe<kj::Exception> local_22a8;
  Void local_2144 [4];
  iterator local_2140;
  undefined8 local_2138;
  Builder local_2130;
  BuilderFor<capnp::List<capnp::Void,_(capnp::Kind)0>_> local_2118;
  Reader local_20f0;
  Reader local_20c0;
  undefined1 auStack_20a0 [8];
  ReaderFor<capnp::List<unsigned_short,_(capnp::Kind)0>_> orig_2;
  Builder local_2058;
  uchar local_203c [4];
  iterator local_2038;
  undefined8 local_2030;
  SegmentReader *local_2028;
  SegmentReader *pSStack_2020;
  CapTableReader *local_2018;
  byte *pbStack_2010;
  ListElementCount local_2008;
  BitsPerElementN<23> BStack_2004;
  StructDataBitCount SStack_2000;
  StructPointerCount SStack_1ffc;
  ElementSize EStack_1ffa;
  undefined1 uStack_1ff9;
  Reader local_1ff8;
  Reader local_1fe8;
  Reader local_1fd8;
  Reader local_1fc8;
  Reader *local_1fb8;
  undefined8 local_1fb0;
  undefined8 local_1fa8;
  undefined8 uStack_1fa0;
  undefined8 local_1f98;
  undefined8 uStack_1f90;
  anon_unknown_0 *local_1f88;
  iterator local_1f80;
  SegmentBuilder *local_1f78;
  SegmentBuilder *pSStack_1f70;
  CapTableBuilder *local_1f68;
  void *pvStack_1f60;
  WirePointer *local_1f58;
  uchar local_1f4c [4];
  iterator local_1f48;
  undefined8 local_1f40;
  SegmentReader *local_1f38;
  SegmentReader *pSStack_1f30;
  CapTableReader *local_1f28;
  byte *pbStack_1f20;
  ListElementCount local_1f18;
  BitsPerElementN<23> BStack_1f14;
  StructDataBitCount SStack_1f10;
  StructPointerCount SStack_1f0c;
  ElementSize EStack_1f0a;
  undefined1 uStack_1f09;
  bool local_1ef9;
  undefined1 *puStack_1ef8;
  bool _kj_shouldLog_17;
  Maybe<kj::Exception> local_1ef0;
  bool local_1d89;
  undefined1 *puStack_1d88;
  bool _kj_shouldLog_16;
  Maybe<kj::Exception> local_1d80;
  bool local_1c19;
  undefined1 *puStack_1c18;
  bool _kj_shouldLog_15;
  Maybe<kj::Exception> local_1c10;
  bool local_1aa9;
  undefined1 *puStack_1aa8;
  bool _kj_shouldLog_14;
  Maybe<kj::Exception> local_1aa0;
  uchar local_193c [4];
  iterator local_1938;
  undefined8 local_1930;
  Builder local_1928;
  BuilderFor<capnp::List<unsigned_char,_(capnp::Kind)0>_> local_1910;
  bool local_18e1;
  undefined1 *puStack_18e0;
  bool _kj_shouldLog_13;
  Maybe<kj::Exception> local_18d8;
  Void local_1774 [4];
  iterator local_1770;
  undefined8 local_1768;
  Builder local_1760;
  BuilderFor<capnp::List<capnp::Void,_(capnp::Kind)0>_> local_1748;
  Reader local_1720;
  Reader local_16f0;
  undefined1 auStack_16d0 [8];
  ReaderFor<capnp::List<unsigned_char,_(capnp::Kind)0>_> orig_1;
  Builder local_1688;
  bool local_1669;
  undefined1 *puStack_1668;
  bool _kj_shouldLog_12;
  Maybe<kj::Exception> local_1660;
  bool local_14fc [4];
  iterator local_14f8;
  undefined8 local_14f0;
  SegmentReader *local_14e8;
  SegmentReader *pSStack_14e0;
  CapTableReader *local_14d8;
  byte *pbStack_14d0;
  ListElementCount local_14c8;
  BitsPerElementN<23> BStack_14c4;
  StructDataBitCount SStack_14c0;
  StructPointerCount SStack_14bc;
  ElementSize EStack_14ba;
  undefined1 uStack_14b9;
  bool local_14a9;
  undefined1 *puStack_14a8;
  bool _kj_shouldLog_11;
  Maybe<kj::Exception> local_14a0;
  bool local_1339;
  undefined1 *puStack_1338;
  bool _kj_shouldLog_10;
  Maybe<kj::Exception> local_1330;
  bool local_11c9;
  undefined1 *puStack_11c8;
  bool _kj_shouldLog_9;
  Maybe<kj::Exception> local_11c0;
  bool local_1059;
  undefined1 *puStack_1058;
  bool _kj_shouldLog_8;
  Maybe<kj::Exception> local_1050;
  bool local_ee9;
  undefined1 *puStack_ee8;
  bool _kj_shouldLog_7;
  Maybe<kj::Exception> local_ee0;
  bool local_d7c [4];
  iterator local_d78;
  undefined8 local_d70;
  Builder local_d68;
  BuilderFor<capnp::List<bool,_(capnp::Kind)0>_> local_d50;
  bool local_d21;
  undefined1 *puStack_d20;
  bool _kj_shouldLog_6;
  Maybe<kj::Exception> local_d18;
  Reader local_bb8;
  Reader local_b88;
  undefined1 auStack_b68 [8];
  ReaderFor<capnp::List<bool,_(capnp::Kind)0>_> orig;
  Builder local_b20;
  Reader local_b08;
  Reader local_af8;
  Reader local_ae8;
  Reader local_ad8;
  Reader *local_ac8;
  undefined8 local_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  anon_unknown_0 *local_a98;
  iterator local_a90;
  SegmentBuilder *local_a88;
  SegmentBuilder *pSStack_a80;
  CapTableBuilder *local_a78;
  void *pvStack_a70;
  WirePointer *local_a68;
  bool local_a59;
  undefined1 *puStack_a58;
  bool _kj_shouldLog_5;
  Maybe<kj::Exception> local_a50;
  bool local_8e9;
  undefined1 *puStack_8e8;
  bool _kj_shouldLog_4;
  Maybe<kj::Exception> local_8e0;
  bool local_779;
  undefined1 *puStack_778;
  bool _kj_shouldLog_3;
  Maybe<kj::Exception> local_770;
  bool local_609;
  undefined1 *puStack_608;
  bool _kj_shouldLog_2;
  Maybe<kj::Exception> local_600;
  bool local_499;
  undefined1 *puStack_498;
  bool _kj_shouldLog_1;
  Maybe<kj::Exception> local_490;
  bool local_329;
  undefined1 *puStack_328;
  bool _kj_shouldLog;
  Maybe<kj::Exception> local_320;
  Void local_1bc [4];
  iterator local_1b8;
  undefined8 local_1b0;
  Builder local_1a8;
  BuilderFor<capnp::List<capnp::Void,_(capnp::Kind)0>_> local_190;
  Void local_164 [4];
  iterator local_160;
  undefined8 local_158;
  Builder local_150;
  undefined1 auStack_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase1089 *this_local;
  WirePointer *pWVar6;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAnyPointer>
            ((Builder *)auStack_128,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_150,(Builder *)auStack_128);
  local_160 = local_164;
  local_158 = 4;
  list_10._M_len = 4;
  list_10._M_array = local_160;
  AnyPointer::Builder::setAs<capnp::List<capnp::Void,(capnp::Kind)0>>(&local_150,list_10);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_1a8,(Builder *)auStack_128);
  AnyPointer::Builder::getAs<capnp::List<capnp::Void,(capnp::Kind)0>>(&local_190,&local_1a8);
  local_1b8 = local_1bc;
  local_1b0 = 4;
  expected_43._M_len = 4;
  expected_43._M_array = local_1b8;
  reader.builder.capTable = local_190.builder.capTable;
  reader.builder.segment = local_190.builder.segment;
  reader.builder.ptr = local_190.builder.ptr;
  reader.builder.elementCount = local_190.builder.elementCount;
  reader.builder.step = local_190.builder.step;
  reader.builder.structDataSize = local_190.builder.structDataSize;
  reader.builder.structPointerCount = local_190.builder.structPointerCount;
  reader.builder.elementSize = local_190.builder.elementSize;
  reader.builder._39_1_ = local_190.builder._39_1_;
  checkList<capnp::List<capnp::Void,_(capnp::Kind)0>::Builder,_capnp::List<capnp::Void,_(capnp::Kind)0>,_false>
            (reader,expected_43);
  puStack_328 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__0>
            (&local_320,(kj *)&stack0xfffffffffffffcd8,func);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_320,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_320);
  func_00 = extraout_RDX;
  if (!bVar1) {
    local_329 = kj::_::Debug::shouldLog(ERROR);
    func_00 = extraout_RDX_00;
    while (local_329 != false) {
      kj::_::Debug::log<char_const(&)[112]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,1099,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
                 ,(char (*) [112])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
                );
      func_00 = extraout_RDX_01;
      local_329 = false;
    }
  }
  puStack_498 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__1>
            (&local_490,(kj *)&stack0xfffffffffffffb68,func_00);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_490,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_490);
  func_01 = extraout_RDX_02;
  if (!bVar1) {
    local_499 = kj::_::Debug::shouldLog(ERROR);
    func_01 = extraout_RDX_03;
    while (local_499 != false) {
      kj::_::Debug::log<char_const(&)[115]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x44c,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint8_t>>(); }) != nullptr\""
                 ,(char (*) [115])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint8_t>>(); }) != nullptr"
                );
      func_01 = extraout_RDX_04;
      local_499 = false;
    }
  }
  puStack_608 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__2>
            (&local_600,(kj *)&stack0xfffffffffffff9f8,func_01);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_600,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_600);
  func_02 = extraout_RDX_05;
  if (!bVar1) {
    local_609 = kj::_::Debug::shouldLog(ERROR);
    func_02 = extraout_RDX_06;
    while (local_609 != false) {
      kj::_::Debug::log<char_const(&)[116]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x44d,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint16_t>>(); }) != nullptr\""
                 ,(char (*) [116])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint16_t>>(); }) != nullptr"
                );
      func_02 = extraout_RDX_07;
      local_609 = false;
    }
  }
  puStack_778 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__3>
            (&local_770,(kj *)&stack0xfffffffffffff888,func_02);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_770,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_770);
  func_03 = extraout_RDX_08;
  if (!bVar1) {
    local_779 = kj::_::Debug::shouldLog(ERROR);
    func_03 = extraout_RDX_09;
    while (local_779 != false) {
      kj::_::Debug::log<char_const(&)[116]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x44e,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr\""
                 ,(char (*) [116])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr"
                );
      func_03 = extraout_RDX_10;
      local_779 = false;
    }
  }
  puStack_8e8 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__4>
            (&local_8e0,(kj *)&stack0xfffffffffffff718,func_03);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_8e0,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_8e0);
  func_04 = extraout_RDX_11;
  if (!bVar1) {
    local_8e9 = kj::_::Debug::shouldLog(ERROR);
    func_04 = extraout_RDX_12;
    while (local_8e9 != false) {
      kj::_::Debug::log<char_const(&)[116]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x44f,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr\""
                 ,(char (*) [116])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr"
                );
      func_04 = extraout_RDX_13;
      local_8e9 = false;
    }
  }
  puStack_a58 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__5>
            (&local_a50,(kj *)&stack0xfffffffffffff5a8,func_04);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_a50,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_a50);
  if (!bVar1) {
    local_a59 = kj::_::Debug::shouldLog(ERROR);
    while (local_a59 != false) {
      kj::_::Debug::log<char_const(&)[112]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x450,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr\""
                 ,(char (*) [112])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr"
                );
      local_a59 = false;
    }
  }
  local_a68 = root._builder.pointers;
  local_a78 = root._builder.capTable;
  pvStack_a70 = root._builder.data;
  local_a88 = (SegmentBuilder *)auStack_128;
  pSStack_a80 = root._builder.segment;
  local_aa8 = 0;
  uStack_aa0 = 0;
  local_ab8 = 0;
  uStack_ab0 = 0;
  local_a98 = (anon_unknown_0 *)&local_ab8;
  local_a90 = (iterator)0x4;
  Text::Reader::Reader(&local_b08,"");
  Text::Reader::Reader(&local_af8,"");
  Text::Reader::Reader(&local_ae8,"");
  Text::Reader::Reader(&local_ad8,"");
  local_ac8 = &local_b08;
  local_ac0 = 4;
  root_00._builder.capTable = (CapTableBuilder *)pSStack_a80;
  root_00._builder.segment = local_a88;
  root_00._builder.data = local_a78;
  root_00._builder.pointers = (WirePointer *)pvStack_a70;
  root_00._builder._32_8_ = local_a68;
  expectedData._M_len = (size_type)local_ac8;
  expectedData._M_array = local_a90;
  expectedPointers._M_len = (size_type)local_a68;
  expectedPointers._M_array = (iterator)0x4;
  checkUpgradedList(local_a98,root_00,expectedData,expectedPointers);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_b20,(Builder *)auStack_128);
  orig.reader._44_1_ = 1;
  orig.reader._45_1_ = 0;
  orig.reader._46_1_ = 1;
  orig.reader._47_1_ = 1;
  list_09._M_len = 4;
  list_09._M_array = (iterator)&orig.reader.field_0x2c;
  AnyPointer::Builder::setAs<capnp::List<bool,(capnp::Kind)0>>(&local_b20,list_09);
  capnproto_test::capnp::test::TestAnyPointer::Builder::asReader(&local_bb8,(Builder *)auStack_128);
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField(&local_b88,&local_bb8);
  AnyPointer::Reader::getAs<capnp::List<bool,(capnp::Kind)0>>
            ((ReaderFor<capnp::List<bool,_(capnp::Kind)0>_> *)auStack_b68,&local_b88);
  puStack_d20 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__6>
            (&local_d18,(kj *)&stack0xfffffffffffff2e0,func_05);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_d18,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_d18);
  if (!bVar1) {
    local_d21 = kj::_::Debug::shouldLog(ERROR);
    while (local_d21 != false) {
      kj::_::Debug::log<char_const(&)[112]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x458,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Void>>(); }) != nullptr\""
                 ,(char (*) [112])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Void>>(); }) != nullptr"
                );
      local_d21 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_d68,(Builder *)auStack_128);
  AnyPointer::Builder::getAs<capnp::List<bool,(capnp::Kind)0>>(&local_d50,&local_d68);
  local_d7c[0] = true;
  local_d7c[1] = false;
  local_d7c[2] = true;
  local_d7c[3] = true;
  local_d78 = local_d7c;
  local_d70 = 4;
  expected_42._M_len = 4;
  expected_42._M_array = local_d78;
  reader_00.builder.capTable = local_d50.builder.capTable;
  reader_00.builder.segment = local_d50.builder.segment;
  reader_00.builder.ptr = local_d50.builder.ptr;
  reader_00.builder.elementCount = local_d50.builder.elementCount;
  reader_00.builder.step = local_d50.builder.step;
  reader_00.builder.structDataSize = local_d50.builder.structDataSize;
  reader_00.builder.structPointerCount = local_d50.builder.structPointerCount;
  reader_00.builder.elementSize = local_d50.builder.elementSize;
  reader_00.builder._39_1_ = local_d50.builder._39_1_;
  checkList<capnp::List<bool,_(capnp::Kind)0>::Builder,_capnp::List<bool,_(capnp::Kind)0>,_false>
            (reader_00,expected_42);
  puStack_ee8 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__7>
            (&local_ee0,(kj *)&stack0xfffffffffffff118,func_06);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_ee0,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_ee0);
  func_07 = extraout_RDX_14;
  if (!bVar1) {
    local_ee9 = kj::_::Debug::shouldLog(ERROR);
    func_07 = extraout_RDX_15;
    while (local_ee9 != false) {
      kj::_::Debug::log<char_const(&)[115]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x45a,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint8_t>>(); }) != nullptr\""
                 ,(char (*) [115])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint8_t>>(); }) != nullptr"
                );
      func_07 = extraout_RDX_16;
      local_ee9 = false;
    }
  }
  puStack_1058 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__8>
            (&local_1050,(kj *)&stack0xffffffffffffefa8,func_07);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_1050,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_1050);
  func_08 = extraout_RDX_17;
  if (!bVar1) {
    local_1059 = kj::_::Debug::shouldLog(ERROR);
    func_08 = extraout_RDX_18;
    while (local_1059 != false) {
      kj::_::Debug::log<char_const(&)[116]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x45b,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint16_t>>(); }) != nullptr\""
                 ,(char (*) [116])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint16_t>>(); }) != nullptr"
                );
      func_08 = extraout_RDX_19;
      local_1059 = false;
    }
  }
  puStack_11c8 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__9>
            (&local_11c0,(kj *)&stack0xffffffffffffee38,func_08);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_11c0,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_11c0);
  func_09 = extraout_RDX_20;
  if (!bVar1) {
    local_11c9 = kj::_::Debug::shouldLog(ERROR);
    func_09 = extraout_RDX_21;
    while (local_11c9 != false) {
      kj::_::Debug::log<char_const(&)[116]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x45c,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr\""
                 ,(char (*) [116])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr"
                );
      func_09 = extraout_RDX_22;
      local_11c9 = false;
    }
  }
  puStack_1338 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__10>
            (&local_1330,(kj *)&stack0xffffffffffffecc8,func_09);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_1330,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_1330);
  func_10 = extraout_RDX_23;
  if (!bVar1) {
    local_1339 = kj::_::Debug::shouldLog(ERROR);
    func_10 = extraout_RDX_24;
    while (local_1339 != false) {
      kj::_::Debug::log<char_const(&)[116]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x45d,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr\""
                 ,(char (*) [116])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr"
                );
      func_10 = extraout_RDX_25;
      local_1339 = false;
    }
  }
  puStack_14a8 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__11>
            (&local_14a0,(kj *)&stack0xffffffffffffeb58,func_10);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_14a0,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_14a0);
  if (!bVar1) {
    local_14a9 = kj::_::Debug::shouldLog(ERROR);
    while (local_14a9 != false) {
      kj::_::Debug::log<char_const(&)[112]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x45e,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr\""
                 ,(char (*) [112])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr"
                );
      local_14a9 = false;
    }
  }
  local_14c8 = orig.reader.elementCount;
  BStack_14c4 = orig.reader.step;
  SStack_14c0 = orig.reader.structDataSize;
  SStack_14bc = orig.reader.structPointerCount;
  EStack_14ba = orig.reader.elementSize;
  uStack_14b9 = orig.reader._39_1_;
  local_14d8 = orig.reader.capTable;
  pbStack_14d0 = orig.reader.ptr;
  local_14e8 = (SegmentReader *)auStack_b68;
  pSStack_14e0 = orig.reader.segment;
  local_14fc[0] = true;
  local_14fc[1] = false;
  local_14fc[2] = true;
  local_14fc[3] = true;
  local_14f8 = local_14fc;
  local_14f0 = 4;
  expected_41._M_len = 4;
  expected_41._M_array = local_14f8;
  reader_31.reader.capTable = (CapTableReader *)orig.reader.segment;
  reader_31.reader.segment = (SegmentReader *)auStack_b68;
  reader_31.reader.ptr = (byte *)orig.reader.capTable;
  reader_31.reader._24_8_ = orig.reader.ptr;
  reader_31.reader._32_8_ = orig.reader._24_8_;
  reader_31.reader.nestingLimit = orig.reader.structDataSize;
  reader_31.reader._44_2_ = orig.reader.structPointerCount;
  reader_31.reader._46_1_ = orig.reader.elementSize;
  reader_31.reader._47_1_ = orig.reader._39_1_;
  checkList<capnp::List<bool,_(capnp::Kind)0>::Reader,_capnp::List<bool,_(capnp::Kind)0>_>
            (reader_31,expected_41);
  puStack_1668 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__12>
            (&local_1660,(kj *)&stack0xffffffffffffe998,func_11);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_1660,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_1660);
  if (!bVar1) {
    local_1669 = kj::_::Debug::shouldLog(ERROR);
    while (local_1669 != false) {
      kj::_::Debug::log<char_const(&)[128]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x463,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<test::TestNewVersion>>(); }) != nullptr\""
                 ,(char (*) [128])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<test::TestNewVersion>>(); }) != nullptr"
                );
      local_1669 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_1688,(Builder *)auStack_128);
  orig_1.reader._44_1_ = 0x12;
  orig_1.reader._45_1_ = 0x23;
  orig_1.reader._46_1_ = 0x33;
  orig_1.reader._47_1_ = 0x44;
  list_08._M_len = 4;
  list_08._M_array = &orig_1.reader.field_0x2c;
  AnyPointer::Builder::setAs<capnp::List<unsigned_char,(capnp::Kind)0>>(&local_1688,list_08);
  capnproto_test::capnp::test::TestAnyPointer::Builder::asReader(&local_1720,(Builder *)auStack_128)
  ;
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField(&local_16f0,&local_1720);
  AnyPointer::Reader::getAs<capnp::List<unsigned_char,(capnp::Kind)0>>
            ((ReaderFor<capnp::List<unsigned_char,_(capnp::Kind)0>_> *)auStack_16d0,&local_16f0);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_1760,(Builder *)auStack_128);
  AnyPointer::Builder::getAs<capnp::List<capnp::Void,(capnp::Kind)0>>(&local_1748,&local_1760);
  local_1770 = local_1774;
  local_1768 = 4;
  expected_40._M_len = 4;
  expected_40._M_array = local_1770;
  reader_01.builder.capTable = local_1748.builder.capTable;
  reader_01.builder.segment = local_1748.builder.segment;
  reader_01.builder.ptr = local_1748.builder.ptr;
  reader_01.builder.elementCount = local_1748.builder.elementCount;
  reader_01.builder.step = local_1748.builder.step;
  reader_01.builder.structDataSize = local_1748.builder.structDataSize;
  reader_01.builder.structPointerCount = local_1748.builder.structPointerCount;
  reader_01.builder.elementSize = local_1748.builder.elementSize;
  reader_01.builder._39_1_ = local_1748.builder._39_1_;
  checkList<capnp::List<capnp::Void,_(capnp::Kind)0>::Builder,_capnp::List<capnp::Void,_(capnp::Kind)0>,_false>
            (reader_01,expected_40);
  puStack_18e0 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__13>
            (&local_18d8,(kj *)&stack0xffffffffffffe720,func_12);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_18d8,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_18d8);
  if (!bVar1) {
    local_18e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_18e1 != false) {
      kj::_::Debug::log<char_const(&)[112]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x46c,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
                 ,(char (*) [112])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
                );
      local_18e1 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_1928,(Builder *)auStack_128);
  AnyPointer::Builder::getAs<capnp::List<unsigned_char,(capnp::Kind)0>>(&local_1910,&local_1928);
  builtin_memcpy(local_193c,"\x12#3D",4);
  local_1938 = local_193c;
  local_1930 = 4;
  expected_39._M_len = 4;
  expected_39._M_array = local_1938;
  reader_02.builder.capTable = local_1910.builder.capTable;
  reader_02.builder.segment = local_1910.builder.segment;
  reader_02.builder.ptr = local_1910.builder.ptr;
  reader_02.builder.elementCount = local_1910.builder.elementCount;
  reader_02.builder.step = local_1910.builder.step;
  reader_02.builder.structDataSize = local_1910.builder.structDataSize;
  reader_02.builder.structPointerCount = local_1910.builder.structPointerCount;
  reader_02.builder.elementSize = local_1910.builder.elementSize;
  reader_02.builder._39_1_ = local_1910.builder._39_1_;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_char,_(capnp::Kind)0>,_false>
            (reader_02,expected_39);
  puStack_1aa8 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__14>
            (&local_1aa0,(kj *)&stack0xffffffffffffe558,func_13);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_1aa0,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_1aa0);
  func_14 = extraout_RDX_26;
  if (!bVar1) {
    local_1aa9 = kj::_::Debug::shouldLog(ERROR);
    func_14 = extraout_RDX_27;
    while (local_1aa9 != false) {
      kj::_::Debug::log<char_const(&)[116]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x46e,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint16_t>>(); }) != nullptr\""
                 ,(char (*) [116])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint16_t>>(); }) != nullptr"
                );
      func_14 = extraout_RDX_28;
      local_1aa9 = false;
    }
  }
  puStack_1c18 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__15>
            (&local_1c10,(kj *)&stack0xffffffffffffe3e8,func_14);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_1c10,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_1c10);
  func_15 = extraout_RDX_29;
  if (!bVar1) {
    local_1c19 = kj::_::Debug::shouldLog(ERROR);
    func_15 = extraout_RDX_30;
    while (local_1c19 != false) {
      kj::_::Debug::log<char_const(&)[116]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x46f,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr\""
                 ,(char (*) [116])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr"
                );
      func_15 = extraout_RDX_31;
      local_1c19 = false;
    }
  }
  puStack_1d88 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__16>
            (&local_1d80,(kj *)&stack0xffffffffffffe278,func_15);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_1d80,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_1d80);
  func_16 = extraout_RDX_32;
  if (!bVar1) {
    local_1d89 = kj::_::Debug::shouldLog(ERROR);
    func_16 = extraout_RDX_33;
    while (local_1d89 != false) {
      kj::_::Debug::log<char_const(&)[116]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x470,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr\""
                 ,(char (*) [116])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr"
                );
      func_16 = extraout_RDX_34;
      local_1d89 = false;
    }
  }
  puStack_1ef8 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__17>
            (&local_1ef0,(kj *)&stack0xffffffffffffe108,func_16);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_1ef0,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_1ef0);
  if (!bVar1) {
    local_1ef9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1ef9 != false) {
      kj::_::Debug::log<char_const(&)[112]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x471,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr\""
                 ,(char (*) [112])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr"
                );
      local_1ef9 = false;
    }
  }
  local_1f18 = orig_1.reader.elementCount;
  BStack_1f14 = orig_1.reader.step;
  SStack_1f10 = orig_1.reader.structDataSize;
  SStack_1f0c = orig_1.reader.structPointerCount;
  EStack_1f0a = orig_1.reader.elementSize;
  uStack_1f09 = orig_1.reader._39_1_;
  local_1f28 = orig_1.reader.capTable;
  pbStack_1f20 = orig_1.reader.ptr;
  local_1f38 = (SegmentReader *)auStack_16d0;
  pSStack_1f30 = orig_1.reader.segment;
  builtin_memcpy(local_1f4c,"\x12#3D",4);
  local_1f48 = local_1f4c;
  local_1f40 = 4;
  expected_38._M_len = 4;
  expected_38._M_array = local_1f48;
  reader_32.reader.capTable = (CapTableReader *)orig_1.reader.segment;
  reader_32.reader.segment = (SegmentReader *)auStack_16d0;
  reader_32.reader.ptr = (byte *)orig_1.reader.capTable;
  reader_32.reader._24_8_ = orig_1.reader.ptr;
  reader_32.reader._32_8_ = orig_1.reader._24_8_;
  reader_32.reader.nestingLimit = orig_1.reader.structDataSize;
  reader_32.reader._44_2_ = orig_1.reader.structPointerCount;
  reader_32.reader._46_1_ = orig_1.reader.elementSize;
  reader_32.reader._47_1_ = orig_1.reader._39_1_;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_char,_(capnp::Kind)0>_>
            (reader_32,expected_38);
  local_1f58 = root._builder.pointers;
  local_1f68 = root._builder.capTable;
  pvStack_1f60 = root._builder.data;
  local_1f78 = (SegmentBuilder *)auStack_128;
  pSStack_1f70 = root._builder.segment;
  local_1f98 = 0x33;
  uStack_1f90 = 0x44;
  local_1fa8 = 0x12;
  uStack_1fa0 = 0x23;
  local_1f88 = (anon_unknown_0 *)&local_1fa8;
  local_1f80 = (iterator)0x4;
  Text::Reader::Reader(&local_1ff8,"");
  Text::Reader::Reader(&local_1fe8,"");
  Text::Reader::Reader(&local_1fd8,"");
  Text::Reader::Reader(&local_1fc8,"");
  local_1fb8 = &local_1ff8;
  local_1fb0 = 4;
  root_01._builder.capTable = (CapTableBuilder *)pSStack_1f70;
  root_01._builder.segment = local_1f78;
  root_01._builder.data = local_1f68;
  root_01._builder.pointers = (WirePointer *)pvStack_1f60;
  root_01._builder._32_8_ = local_1f58;
  expectedData_00._M_len = (size_type)local_1fb8;
  expectedData_00._M_array = local_1f80;
  expectedPointers_00._M_len = (size_type)local_1f58;
  expectedPointers_00._M_array = (iterator)0x4;
  checkUpgradedList(local_1f88,root_01,expectedData_00,expectedPointers_00);
  local_2008 = orig_1.reader.elementCount;
  BStack_2004 = orig_1.reader.step;
  SStack_2000 = orig_1.reader.structDataSize;
  SStack_1ffc = orig_1.reader.structPointerCount;
  EStack_1ffa = orig_1.reader.elementSize;
  uStack_1ff9 = orig_1.reader._39_1_;
  local_2018 = orig_1.reader.capTable;
  pbStack_2010 = orig_1.reader.ptr;
  local_2028 = (SegmentReader *)auStack_16d0;
  pSStack_2020 = orig_1.reader.segment;
  local_203c[0] = '\0';
  local_203c[1] = 0;
  local_203c[2] = 0;
  local_203c[3] = 0;
  local_2038 = local_203c;
  local_2030 = 4;
  expected_37._M_len = 4;
  expected_37._M_array = local_2038;
  reader_33.reader.capTable = (CapTableReader *)orig_1.reader.segment;
  reader_33.reader.segment = (SegmentReader *)auStack_16d0;
  reader_33.reader.ptr = (byte *)orig_1.reader.capTable;
  reader_33.reader._24_8_ = orig_1.reader.ptr;
  reader_33.reader._32_8_ = orig_1.reader._24_8_;
  reader_33.reader.nestingLimit = orig_1.reader.structDataSize;
  reader_33.reader._44_2_ = orig_1.reader.structPointerCount;
  reader_33.reader._46_1_ = orig_1.reader.elementSize;
  reader_33.reader._47_1_ = orig_1.reader._39_1_;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_char,_(capnp::Kind)0>_>
            (reader_33,expected_37);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_2058,(Builder *)auStack_128);
  orig_2.reader.nestingLimit._0_2_ = 0x5612;
  orig_2.reader.nestingLimit._2_2_ = 0x7823;
  orig_2.reader._44_2_ = 0xab33;
  orig_2.reader._46_2_ = 0xcd44;
  list_07._M_len = 4;
  list_07._M_array = (iterator)&orig_2.reader.nestingLimit;
  AnyPointer::Builder::setAs<capnp::List<unsigned_short,(capnp::Kind)0>>(&local_2058,list_07);
  capnproto_test::capnp::test::TestAnyPointer::Builder::asReader(&local_20f0,(Builder *)auStack_128)
  ;
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField(&local_20c0,&local_20f0);
  AnyPointer::Reader::getAs<capnp::List<unsigned_short,(capnp::Kind)0>>
            ((ReaderFor<capnp::List<unsigned_short,_(capnp::Kind)0>_> *)auStack_20a0,&local_20c0);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_2130,(Builder *)auStack_128);
  AnyPointer::Builder::getAs<capnp::List<capnp::Void,(capnp::Kind)0>>(&local_2118,&local_2130);
  local_2140 = local_2144;
  local_2138 = 4;
  expected_36._M_len = 4;
  expected_36._M_array = local_2140;
  reader_03.builder.capTable = local_2118.builder.capTable;
  reader_03.builder.segment = local_2118.builder.segment;
  reader_03.builder.ptr = local_2118.builder.ptr;
  reader_03.builder.elementCount = local_2118.builder.elementCount;
  reader_03.builder.step = local_2118.builder.step;
  reader_03.builder.structDataSize = local_2118.builder.structDataSize;
  reader_03.builder.structPointerCount = local_2118.builder.structPointerCount;
  reader_03.builder.elementSize = local_2118.builder.elementSize;
  reader_03.builder._39_1_ = local_2118.builder._39_1_;
  checkList<capnp::List<capnp::Void,_(capnp::Kind)0>::Builder,_capnp::List<capnp::Void,_(capnp::Kind)0>,_false>
            (reader_03,expected_36);
  puStack_22b0 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__18>
            (&local_22a8,(kj *)&stack0xffffffffffffdd50,func_17);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_22a8,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_22a8);
  if (!bVar1) {
    local_22b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_22b1 != false) {
      kj::_::Debug::log<char_const(&)[112]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x47e,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
                 ,(char (*) [112])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
                );
      local_22b1 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_22f8,(Builder *)auStack_128);
  AnyPointer::Builder::getAs<capnp::List<unsigned_char,(capnp::Kind)0>>(&local_22e0,&local_22f8);
  builtin_memcpy(local_230c,"\x12#3D",4);
  local_2308 = local_230c;
  local_2300 = 4;
  expected_35._M_len = 4;
  expected_35._M_array = local_2308;
  reader_04.builder.capTable = local_22e0.builder.capTable;
  reader_04.builder.segment = local_22e0.builder.segment;
  reader_04.builder.ptr = local_22e0.builder.ptr;
  reader_04.builder.elementCount = local_22e0.builder.elementCount;
  reader_04.builder.step = local_22e0.builder.step;
  reader_04.builder.structDataSize = local_22e0.builder.structDataSize;
  reader_04.builder.structPointerCount = local_22e0.builder.structPointerCount;
  reader_04.builder.elementSize = local_22e0.builder.elementSize;
  reader_04.builder._39_1_ = local_22e0.builder._39_1_;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_char,_(capnp::Kind)0>,_false>
            (reader_04,expected_35);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_2350,(Builder *)auStack_128);
  AnyPointer::Builder::getAs<capnp::List<unsigned_short,(capnp::Kind)0>>(&local_2338,&local_2350);
  local_2368[0] = 0x5612;
  local_2368[1] = 0x7823;
  local_2368[2] = 0xab33;
  local_2368[3] = 0xcd44;
  local_2360 = local_2368;
  local_2358 = 4;
  expected_34._M_len = 4;
  expected_34._M_array = local_2360;
  reader_05.builder.capTable = local_2338.builder.capTable;
  reader_05.builder.segment = local_2338.builder.segment;
  reader_05.builder.ptr = local_2338.builder.ptr;
  reader_05.builder.elementCount = local_2338.builder.elementCount;
  reader_05.builder.step = local_2338.builder.step;
  reader_05.builder.structDataSize = local_2338.builder.structDataSize;
  reader_05.builder.structPointerCount = local_2338.builder.structPointerCount;
  reader_05.builder.elementSize = local_2338.builder.elementSize;
  reader_05.builder._39_1_ = local_2338.builder._39_1_;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_short,_(capnp::Kind)0>,_false>
            (reader_05,expected_34);
  puStack_24d0 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__19>
            (&local_24c8,(kj *)&stack0xffffffffffffdb30,func_18);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_24c8,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_24c8);
  func_19 = extraout_RDX_35;
  if (!bVar1) {
    local_24d1 = kj::_::Debug::shouldLog(ERROR);
    func_19 = extraout_RDX_36;
    while (local_24d1 != false) {
      kj::_::Debug::log<char_const(&)[116]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x481,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr\""
                 ,(char (*) [116])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr"
                );
      func_19 = extraout_RDX_37;
      local_24d1 = false;
    }
  }
  puStack_2640 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__20>
            (&local_2638,(kj *)&stack0xffffffffffffd9c0,func_19);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_2638,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_2638);
  func_20 = extraout_RDX_38;
  if (!bVar1) {
    local_2641 = kj::_::Debug::shouldLog(ERROR);
    func_20 = extraout_RDX_39;
    while (local_2641 != false) {
      kj::_::Debug::log<char_const(&)[116]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x482,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr\""
                 ,(char (*) [116])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr"
                );
      func_20 = extraout_RDX_40;
      local_2641 = false;
    }
  }
  puStack_27b0 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__21>
            (&local_27a8,(kj *)&stack0xffffffffffffd850,func_20);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_27a8,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_27a8);
  if (!bVar1) {
    local_27b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_27b1 != false) {
      kj::_::Debug::log<char_const(&)[112]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x483,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr\""
                 ,(char (*) [112])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr"
                );
      local_27b1 = false;
    }
  }
  local_27c8 = orig_2.reader.elementCount;
  BStack_27c4 = orig_2.reader.step;
  SStack_27c0 = orig_2.reader.structDataSize;
  SStack_27bc = orig_2.reader.structPointerCount;
  EStack_27ba = orig_2.reader.elementSize;
  uStack_27b9 = orig_2.reader._39_1_;
  local_27d8 = orig_2.reader.capTable;
  pbStack_27d0 = orig_2.reader.ptr;
  local_27e8 = (SegmentReader *)auStack_20a0;
  pSStack_27e0 = orig_2.reader.segment;
  local_2800[0] = 0x5612;
  local_2800[1] = 0x7823;
  local_2800[2] = 0xab33;
  local_2800[3] = 0xcd44;
  local_27f8 = local_2800;
  local_27f0 = 4;
  expected_33._M_len = 4;
  expected_33._M_array = local_27f8;
  reader_34.reader.capTable = (CapTableReader *)orig_2.reader.segment;
  reader_34.reader.segment = (SegmentReader *)auStack_20a0;
  reader_34.reader.ptr = (byte *)orig_2.reader.capTable;
  reader_34.reader._24_8_ = orig_2.reader.ptr;
  reader_34.reader._32_8_ = orig_2.reader._24_8_;
  reader_34.reader.nestingLimit = orig_2.reader.structDataSize;
  reader_34.reader._44_2_ = orig_2.reader.structPointerCount;
  reader_34.reader._46_1_ = orig_2.reader.elementSize;
  reader_34.reader._47_1_ = orig_2.reader._39_1_;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_short,_(capnp::Kind)0>_>
            (reader_34,expected_33);
  local_2808 = root._builder.pointers;
  local_2818 = root._builder.capTable;
  pvStack_2810 = root._builder.data;
  local_2828 = (SegmentBuilder *)auStack_128;
  pSStack_2820 = root._builder.segment;
  local_2848 = 0xab33;
  uStack_2840 = 0xcd44;
  local_2858 = 0x5612;
  uStack_2850 = 0x7823;
  local_2838 = (anon_unknown_0 *)&local_2858;
  local_2830 = (iterator)0x4;
  Text::Reader::Reader(&local_28a8,"");
  Text::Reader::Reader(&local_2898,"");
  Text::Reader::Reader(&local_2888,"");
  Text::Reader::Reader(&local_2878,"");
  local_2868 = &local_28a8;
  local_2860 = 4;
  root_02._builder.capTable = (CapTableBuilder *)pSStack_2820;
  root_02._builder.segment = local_2828;
  root_02._builder.data = local_2818;
  root_02._builder.pointers = (WirePointer *)pvStack_2810;
  root_02._builder._32_8_ = local_2808;
  expectedData_01._M_len = (size_type)local_2868;
  expectedData_01._M_array = local_2830;
  expectedPointers_01._M_len = (size_type)local_2808;
  expectedPointers_01._M_array = (iterator)0x4;
  checkUpgradedList(local_2838,root_02,expectedData_01,expectedPointers_01);
  local_28b8 = orig_2.reader.elementCount;
  BStack_28b4 = orig_2.reader.step;
  SStack_28b0 = orig_2.reader.structDataSize;
  SStack_28ac = orig_2.reader.structPointerCount;
  EStack_28aa = orig_2.reader.elementSize;
  uStack_28a9 = orig_2.reader._39_1_;
  local_28c8 = orig_2.reader.capTable;
  pbStack_28c0 = orig_2.reader.ptr;
  local_28d8 = (SegmentReader *)auStack_20a0;
  pSStack_28d0 = orig_2.reader.segment;
  local_28f0[0] = 0;
  local_28f0[1] = 0;
  local_28f0[2] = 0;
  local_28f0[3] = 0;
  local_28e8 = local_28f0;
  local_28e0 = 4;
  expected_32._M_len = 4;
  expected_32._M_array = local_28e8;
  reader_35.reader.capTable = (CapTableReader *)orig_2.reader.segment;
  reader_35.reader.segment = (SegmentReader *)auStack_20a0;
  reader_35.reader.ptr = (byte *)orig_2.reader.capTable;
  reader_35.reader._24_8_ = orig_2.reader.ptr;
  reader_35.reader._32_8_ = orig_2.reader._24_8_;
  reader_35.reader.nestingLimit = orig_2.reader.structDataSize;
  reader_35.reader._44_2_ = orig_2.reader.structPointerCount;
  reader_35.reader._46_1_ = orig_2.reader.elementSize;
  reader_35.reader._47_1_ = orig_2.reader._39_1_;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_short,_(capnp::Kind)0>_>
            (reader_35,expected_32);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_2908,(Builder *)auStack_128);
  orig_3.reader.nestingLimit = 0x17595612;
  orig_3.reader._44_4_ = 0x29347823;
  list_06._M_len = 4;
  list_06._M_array = (iterator)&orig_3.reader.nestingLimit;
  AnyPointer::Builder::setAs<capnp::List<unsigned_int,(capnp::Kind)0>>(&local_2908,list_06);
  capnproto_test::capnp::test::TestAnyPointer::Builder::asReader(&local_29a8,(Builder *)auStack_128)
  ;
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField(&local_2978,&local_29a8);
  AnyPointer::Reader::getAs<capnp::List<unsigned_int,(capnp::Kind)0>>
            ((ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)auStack_2958,&local_2978);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_29e8,(Builder *)auStack_128);
  AnyPointer::Builder::getAs<capnp::List<capnp::Void,(capnp::Kind)0>>(&local_29d0,&local_29e8);
  local_29f8 = local_29fc;
  local_29f0 = 4;
  expected_31._M_len = 4;
  expected_31._M_array = local_29f8;
  reader_06.builder.capTable = local_29d0.builder.capTable;
  reader_06.builder.segment = local_29d0.builder.segment;
  reader_06.builder.ptr = local_29d0.builder.ptr;
  reader_06.builder.elementCount = local_29d0.builder.elementCount;
  reader_06.builder.step = local_29d0.builder.step;
  reader_06.builder.structDataSize = local_29d0.builder.structDataSize;
  reader_06.builder.structPointerCount = local_29d0.builder.structPointerCount;
  reader_06.builder.elementSize = local_29d0.builder.elementSize;
  reader_06.builder._39_1_ = local_29d0.builder._39_1_;
  checkList<capnp::List<capnp::Void,_(capnp::Kind)0>::Builder,_capnp::List<capnp::Void,_(capnp::Kind)0>,_false>
            (reader_06,expected_31);
  puStack_2b68 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__22>
            (&local_2b60,(kj *)&stack0xffffffffffffd498,func_21);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_2b60,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_2b60);
  if (!bVar1) {
    local_2b69 = kj::_::Debug::shouldLog(ERROR);
    while (local_2b69 != false) {
      kj::_::Debug::log<char_const(&)[112]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x490,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
                 ,(char (*) [112])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
                );
      local_2b69 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_2bb0,(Builder *)auStack_128);
  AnyPointer::Builder::getAs<capnp::List<unsigned_char,(capnp::Kind)0>>(&local_2b98,&local_2bb0);
  builtin_memcpy(local_2bc4,"\x12#2E",4);
  local_2bc0 = local_2bc4;
  local_2bb8 = 4;
  expected_30._M_len = 4;
  expected_30._M_array = local_2bc0;
  reader_07.builder.capTable = local_2b98.builder.capTable;
  reader_07.builder.segment = local_2b98.builder.segment;
  reader_07.builder.ptr = local_2b98.builder.ptr;
  reader_07.builder.elementCount = local_2b98.builder.elementCount;
  reader_07.builder.step = local_2b98.builder.step;
  reader_07.builder.structDataSize = local_2b98.builder.structDataSize;
  reader_07.builder.structPointerCount = local_2b98.builder.structPointerCount;
  reader_07.builder.elementSize = local_2b98.builder.elementSize;
  reader_07.builder._39_1_ = local_2b98.builder._39_1_;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_char,_(capnp::Kind)0>,_false>
            (reader_07,expected_30);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_2c08,(Builder *)auStack_128);
  AnyPointer::Builder::getAs<capnp::List<unsigned_short,(capnp::Kind)0>>(&local_2bf0,&local_2c08);
  local_2c20[0] = 0x5612;
  local_2c20[1] = 0x7823;
  local_2c20[2] = 0xab32;
  local_2c20[3] = 0xcd45;
  local_2c18 = local_2c20;
  local_2c10 = 4;
  expected_29._M_len = 4;
  expected_29._M_array = local_2c18;
  reader_08.builder.capTable = local_2bf0.builder.capTable;
  reader_08.builder.segment = local_2bf0.builder.segment;
  reader_08.builder.ptr = local_2bf0.builder.ptr;
  reader_08.builder.elementCount = local_2bf0.builder.elementCount;
  reader_08.builder.step = local_2bf0.builder.step;
  reader_08.builder.structDataSize = local_2bf0.builder.structDataSize;
  reader_08.builder.structPointerCount = local_2bf0.builder.structPointerCount;
  reader_08.builder.elementSize = local_2bf0.builder.elementSize;
  reader_08.builder._39_1_ = local_2bf0.builder._39_1_;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_short,_(capnp::Kind)0>,_false>
            (reader_08,expected_29);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_2c60,(Builder *)auStack_128);
  AnyPointer::Builder::getAs<capnp::List<unsigned_int,(capnp::Kind)0>>(&local_2c48,&local_2c60);
  local_2c80[0] = 0x17595612;
  local_2c80[1] = 0x29347823;
  local_2c80[2] = 0x5923ab32;
  local_2c80[3] = 0x1a39cd45;
  local_2c70 = local_2c80;
  local_2c68 = 4;
  expected_28._M_len = 4;
  expected_28._M_array = local_2c70;
  reader_09.builder.capTable = local_2c48.builder.capTable;
  reader_09.builder.segment = local_2c48.builder.segment;
  reader_09.builder.ptr = local_2c48.builder.ptr;
  reader_09.builder.elementCount = local_2c48.builder.elementCount;
  reader_09.builder.step = local_2c48.builder.step;
  reader_09.builder.structDataSize = local_2c48.builder.structDataSize;
  reader_09.builder.structPointerCount = local_2c48.builder.structPointerCount;
  reader_09.builder.elementSize = local_2c48.builder.elementSize;
  reader_09.builder._39_1_ = local_2c48.builder._39_1_;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_int,_(capnp::Kind)0>,_false>
            (reader_09,expected_28);
  puStack_2de8 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__23>
            (&local_2de0,(kj *)&stack0xffffffffffffd218,func_22);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_2de0,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_2de0);
  func_23 = extraout_RDX_41;
  if (!bVar1) {
    local_2de9 = kj::_::Debug::shouldLog(ERROR);
    func_23 = extraout_RDX_42;
    while (local_2de9 != false) {
      kj::_::Debug::log<char_const(&)[116]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x494,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr\""
                 ,(char (*) [116])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr"
                );
      func_23 = extraout_RDX_43;
      local_2de9 = false;
    }
  }
  puStack_2f58 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__24>
            (&local_2f50,(kj *)&stack0xffffffffffffd0a8,func_23);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_2f50,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_2f50);
  if (!bVar1) {
    local_2f59 = kj::_::Debug::shouldLog(ERROR);
    while (local_2f59 != false) {
      kj::_::Debug::log<char_const(&)[112]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x495,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr\""
                 ,(char (*) [112])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr"
                );
      local_2f59 = false;
    }
  }
  local_2f78 = orig_3.reader.elementCount;
  BStack_2f74 = orig_3.reader.step;
  SStack_2f70 = orig_3.reader.structDataSize;
  SStack_2f6c = orig_3.reader.structPointerCount;
  EStack_2f6a = orig_3.reader.elementSize;
  uStack_2f69 = orig_3.reader._39_1_;
  local_2f88 = orig_3.reader.capTable;
  pbStack_2f80 = orig_3.reader.ptr;
  local_2f98 = (SegmentReader *)auStack_2958;
  pSStack_2f90 = orig_3.reader.segment;
  local_2fb8[0] = 0x17595612;
  local_2fb8[1] = 0x29347823;
  local_2fb8[2] = 0x5923ab32;
  local_2fb8[3] = 0x1a39cd45;
  local_2fa8 = local_2fb8;
  local_2fa0 = 4;
  expected_27._M_len = 4;
  expected_27._M_array = local_2fa8;
  reader_36.reader.capTable = (CapTableReader *)orig_3.reader.segment;
  reader_36.reader.segment = (SegmentReader *)auStack_2958;
  reader_36.reader.ptr = (byte *)orig_3.reader.capTable;
  reader_36.reader._24_8_ = orig_3.reader.ptr;
  reader_36.reader._32_8_ = orig_3.reader._24_8_;
  reader_36.reader.nestingLimit = orig_3.reader.structDataSize;
  reader_36.reader._44_2_ = orig_3.reader.structPointerCount;
  reader_36.reader._46_1_ = orig_3.reader.elementSize;
  reader_36.reader._47_1_ = orig_3.reader._39_1_;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_int,_(capnp::Kind)0>_>
            (reader_36,expected_27);
  local_2fc8 = root._builder.pointers;
  local_2fd8 = root._builder.capTable;
  pvStack_2fd0 = root._builder.data;
  local_2fe8 = (SegmentBuilder *)auStack_128;
  pSStack_2fe0 = root._builder.segment;
  local_3008 = 0x5923ab32;
  uStack_3000 = 0x1a39cd45;
  local_3018 = 0x17595612;
  uStack_3010 = 0x29347823;
  local_2ff8 = (anon_unknown_0 *)&local_3018;
  local_2ff0 = (iterator)0x4;
  Text::Reader::Reader(&local_3068,"");
  Text::Reader::Reader(&local_3058,"");
  Text::Reader::Reader(&local_3048,"");
  Text::Reader::Reader(&local_3038,"");
  local_3028 = &local_3068;
  local_3020 = 4;
  root_03._builder.capTable = (CapTableBuilder *)pSStack_2fe0;
  root_03._builder.segment = local_2fe8;
  root_03._builder.data = local_2fd8;
  root_03._builder.pointers = (WirePointer *)pvStack_2fd0;
  root_03._builder._32_8_ = local_2fc8;
  expectedData_02._M_len = (size_type)local_3028;
  expectedData_02._M_array = local_2ff0;
  expectedPointers_02._M_len = (size_type)local_2fc8;
  expectedPointers_02._M_array = (iterator)0x4;
  checkUpgradedList(local_2ff8,root_03,expectedData_02,expectedPointers_02);
  local_3078 = orig_3.reader.elementCount;
  BStack_3074 = orig_3.reader.step;
  SStack_3070 = orig_3.reader.structDataSize;
  SStack_306c = orig_3.reader.structPointerCount;
  EStack_306a = orig_3.reader.elementSize;
  uStack_3069 = orig_3.reader._39_1_;
  local_3088 = orig_3.reader.capTable;
  pbStack_3080 = orig_3.reader.ptr;
  local_3098 = (SegmentReader *)auStack_2958;
  pSStack_3090 = orig_3.reader.segment;
  local_30b8[0] = 0;
  local_30b8[1] = 0;
  local_30b8[2] = 0;
  local_30b8[3] = 0;
  local_30a8 = local_30b8;
  local_30a0 = 4;
  expected_26._M_len = 4;
  expected_26._M_array = local_30a8;
  reader_37.reader.capTable = (CapTableReader *)orig_3.reader.segment;
  reader_37.reader.segment = (SegmentReader *)auStack_2958;
  reader_37.reader.ptr = (byte *)orig_3.reader.capTable;
  reader_37.reader._24_8_ = orig_3.reader.ptr;
  reader_37.reader._32_8_ = orig_3.reader._24_8_;
  reader_37.reader.nestingLimit = orig_3.reader.structDataSize;
  reader_37.reader._44_2_ = orig_3.reader.structPointerCount;
  reader_37.reader._46_1_ = orig_3.reader.elementSize;
  reader_37.reader._47_1_ = orig_3.reader._39_1_;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_int,_(capnp::Kind)0>_>
            (reader_37,expected_26);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_30d0,(Builder *)auStack_128);
  orig_4.reader.nestingLimit = -0x78ca01df;
  orig_4.reader._44_4_ = 0x1234abcd;
  list_05._M_len = 2;
  list_05._M_array = (iterator)&orig_4.reader.nestingLimit;
  AnyPointer::Builder::setAs<capnp::List<unsigned_long,(capnp::Kind)0>>(&local_30d0,list_05);
  capnproto_test::capnp::test::TestAnyPointer::Builder::asReader(&local_3170,(Builder *)auStack_128)
  ;
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField(&local_3140,&local_3170);
  AnyPointer::Reader::getAs<capnp::List<unsigned_long,(capnp::Kind)0>>
            ((ReaderFor<capnp::List<unsigned_long,_(capnp::Kind)0>_> *)auStack_3120,&local_3140);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_31b0,(Builder *)auStack_128);
  AnyPointer::Builder::getAs<capnp::List<capnp::Void,(capnp::Kind)0>>(&local_3198,&local_31b0);
  local_31c0 = local_31c2;
  local_31b8 = 2;
  expected_25._M_len = 2;
  expected_25._M_array = local_31c0;
  reader_10.builder.capTable = local_3198.builder.capTable;
  reader_10.builder.segment = local_3198.builder.segment;
  reader_10.builder.ptr = local_3198.builder.ptr;
  reader_10.builder.elementCount = local_3198.builder.elementCount;
  reader_10.builder.step = local_3198.builder.step;
  reader_10.builder.structDataSize = local_3198.builder.structDataSize;
  reader_10.builder.structPointerCount = local_3198.builder.structPointerCount;
  reader_10.builder.elementSize = local_3198.builder.elementSize;
  reader_10.builder._39_1_ = local_3198.builder._39_1_;
  checkList<capnp::List<capnp::Void,_(capnp::Kind)0>::Builder,_capnp::List<capnp::Void,_(capnp::Kind)0>,_false>
            (reader_10,expected_25);
  puStack_3330 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__25>
            (&local_3328,(kj *)&stack0xffffffffffffccd0,func_24);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_3328,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_3328);
  if (!bVar1) {
    local_3331 = kj::_::Debug::shouldLog(ERROR);
    while (local_3331 != false) {
      kj::_::Debug::log<char_const(&)[112]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x4a2,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
                 ,(char (*) [112])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
                );
      local_3331 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_3378,(Builder *)auStack_128);
  AnyPointer::Builder::getAs<capnp::List<unsigned_char,(capnp::Kind)0>>(&local_3360,&local_3378);
  local_338a[0] = '!';
  local_338a[1] = 0x36;
  local_3388 = local_338a;
  local_3380 = 2;
  expected_24._M_len = 2;
  expected_24._M_array = local_3388;
  reader_11.builder.capTable = local_3360.builder.capTable;
  reader_11.builder.segment = local_3360.builder.segment;
  reader_11.builder.ptr = local_3360.builder.ptr;
  reader_11.builder.elementCount = local_3360.builder.elementCount;
  reader_11.builder.step = local_3360.builder.step;
  reader_11.builder.structDataSize = local_3360.builder.structDataSize;
  reader_11.builder.structPointerCount = local_3360.builder.structPointerCount;
  reader_11.builder.elementSize = local_3360.builder.elementSize;
  reader_11.builder._39_1_ = local_3360.builder._39_1_;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_char,_(capnp::Kind)0>,_false>
            (reader_11,expected_24);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_33d0,(Builder *)auStack_128);
  AnyPointer::Builder::getAs<capnp::List<unsigned_short,(capnp::Kind)0>>(&local_33b8,&local_33d0);
  local_33e4[0] = 0xfe21;
  local_33e4[1] = 0xaf36;
  local_33e0 = local_33e4;
  local_33d8 = 2;
  expected_23._M_len = 2;
  expected_23._M_array = local_33e0;
  reader_12.builder.capTable = local_33b8.builder.capTable;
  reader_12.builder.segment = local_33b8.builder.segment;
  reader_12.builder.ptr = local_33b8.builder.ptr;
  reader_12.builder.elementCount = local_33b8.builder.elementCount;
  reader_12.builder.step = local_33b8.builder.step;
  reader_12.builder.structDataSize = local_33b8.builder.structDataSize;
  reader_12.builder.structPointerCount = local_33b8.builder.structPointerCount;
  reader_12.builder.elementSize = local_33b8.builder.elementSize;
  reader_12.builder._39_1_ = local_33b8.builder._39_1_;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_short,_(capnp::Kind)0>,_false>
            (reader_12,expected_23);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_3428,(Builder *)auStack_128);
  AnyPointer::Builder::getAs<capnp::List<unsigned_int,(capnp::Kind)0>>(&local_3410,&local_3428);
  local_3440[0] = 0x8735fe21;
  local_3440[1] = 0x1923af36;
  local_3438 = local_3440;
  local_3430 = 2;
  expected_22._M_len = 2;
  expected_22._M_array = local_3438;
  reader_13.builder.capTable = local_3410.builder.capTable;
  reader_13.builder.segment = local_3410.builder.segment;
  reader_13.builder.ptr = local_3410.builder.ptr;
  reader_13.builder.elementCount = local_3410.builder.elementCount;
  reader_13.builder.step = local_3410.builder.step;
  reader_13.builder.structDataSize = local_3410.builder.structDataSize;
  reader_13.builder.structPointerCount = local_3410.builder.structPointerCount;
  reader_13.builder.elementSize = local_3410.builder.elementSize;
  reader_13.builder._39_1_ = local_3410.builder._39_1_;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_int,_(capnp::Kind)0>,_false>
            (reader_13,expected_22);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_3480,(Builder *)auStack_128);
  AnyPointer::Builder::getAs<capnp::List<unsigned_long,(capnp::Kind)0>>(&local_3468,&local_3480);
  local_34a0[0] = 0x1234abcd8735fe21;
  local_34a0[1] = 0x7173bc0e1923af36;
  local_3490 = local_34a0;
  local_3488 = 2;
  expected_21._M_len = 2;
  expected_21._M_array = local_3490;
  reader_14.builder.capTable = local_3468.builder.capTable;
  reader_14.builder.segment = local_3468.builder.segment;
  reader_14.builder.ptr = local_3468.builder.ptr;
  reader_14.builder.elementCount = local_3468.builder.elementCount;
  reader_14.builder.step = local_3468.builder.step;
  reader_14.builder.structDataSize = local_3468.builder.structDataSize;
  reader_14.builder.structPointerCount = local_3468.builder.structPointerCount;
  reader_14.builder.elementSize = local_3468.builder.elementSize;
  reader_14.builder._39_1_ = local_3468.builder._39_1_;
  checkList<capnp::List<unsigned_long,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_long,_(capnp::Kind)0>,_false>
            (reader_14,expected_21);
  puStack_3608 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__26>
            (&local_3600,(kj *)&stack0xffffffffffffc9f8,func_25);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_3600,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_3600);
  if (!bVar1) {
    local_3609 = kj::_::Debug::shouldLog(ERROR);
    while (local_3609 != false) {
      kj::_::Debug::log<char_const(&)[112]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x4a7,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr\""
                 ,(char (*) [112])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr"
                );
      local_3609 = false;
    }
  }
  local_3628 = orig_4.reader.elementCount;
  BStack_3624 = orig_4.reader.step;
  SStack_3620 = orig_4.reader.structDataSize;
  SStack_361c = orig_4.reader.structPointerCount;
  EStack_361a = orig_4.reader.elementSize;
  uStack_3619 = orig_4.reader._39_1_;
  local_3638 = orig_4.reader.capTable;
  pbStack_3630 = orig_4.reader.ptr;
  local_3648 = (SegmentReader *)auStack_3120;
  pSStack_3640 = orig_4.reader.segment;
  local_3668[0] = 0x1234abcd8735fe21;
  local_3668[1] = 0x7173bc0e1923af36;
  local_3658 = local_3668;
  local_3650 = 2;
  expected_20._M_len = 2;
  expected_20._M_array = local_3658;
  reader_38.reader.capTable = (CapTableReader *)orig_4.reader.segment;
  reader_38.reader.segment = (SegmentReader *)auStack_3120;
  reader_38.reader.ptr = (byte *)orig_4.reader.capTable;
  reader_38.reader._24_8_ = orig_4.reader.ptr;
  reader_38.reader._32_8_ = orig_4.reader._24_8_;
  reader_38.reader.nestingLimit = orig_4.reader.structDataSize;
  reader_38.reader._44_2_ = orig_4.reader.structPointerCount;
  reader_38.reader._46_1_ = orig_4.reader.elementSize;
  reader_38.reader._47_1_ = orig_4.reader._39_1_;
  checkList<capnp::List<unsigned_long,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_long,_(capnp::Kind)0>_>
            (reader_38,expected_20);
  local_3678 = root._builder.pointers;
  local_3688 = root._builder.capTable;
  pvStack_3680 = root._builder.data;
  local_3698 = (SegmentBuilder *)auStack_128;
  pSStack_3690 = root._builder.segment;
  local_36b8 = 0x1234abcd8735fe21;
  local_36b0 = 0x7173bc0e1923af36;
  local_36a8 = (anon_unknown_0 *)&local_36b8;
  local_36a0 = (iterator)0x2;
  Text::Reader::Reader(&local_36e8,"");
  Text::Reader::Reader(&local_36d8,"");
  local_36c8 = &local_36e8;
  local_36c0 = 2;
  root_04._builder.capTable = (CapTableBuilder *)pSStack_3690;
  root_04._builder.segment = local_3698;
  root_04._builder.data = local_3688;
  root_04._builder.pointers = (WirePointer *)pvStack_3680;
  root_04._builder._32_8_ = local_3678;
  expectedData_03._M_len = (size_type)local_36c8;
  expectedData_03._M_array = local_36a0;
  expectedPointers_03._M_len = (size_type)local_3678;
  expectedPointers_03._M_array = (iterator)0x2;
  checkUpgradedList(local_36a8,root_04,expectedData_03,expectedPointers_03);
  local_36f8 = orig_4.reader.elementCount;
  BStack_36f4 = orig_4.reader.step;
  SStack_36f0 = orig_4.reader.structDataSize;
  SStack_36ec = orig_4.reader.structPointerCount;
  EStack_36ea = orig_4.reader.elementSize;
  uStack_36e9 = orig_4.reader._39_1_;
  local_3708 = orig_4.reader.capTable;
  pbStack_3700 = orig_4.reader.ptr;
  local_3718 = (SegmentReader *)auStack_3120;
  pSStack_3710 = orig_4.reader.segment;
  local_3738[0] = 0;
  local_3738[1] = 0;
  local_3728 = local_3738;
  local_3720 = 2;
  expected_19._M_len = 2;
  expected_19._M_array = local_3728;
  reader_39.reader.capTable = (CapTableReader *)orig_4.reader.segment;
  reader_39.reader.segment = (SegmentReader *)auStack_3120;
  reader_39.reader.ptr = (byte *)orig_4.reader.capTable;
  reader_39.reader._24_8_ = orig_4.reader.ptr;
  reader_39.reader._32_8_ = orig_4.reader._24_8_;
  reader_39.reader.nestingLimit = orig_4.reader.structDataSize;
  reader_39.reader._44_2_ = orig_4.reader.structPointerCount;
  reader_39.reader._46_1_ = orig_4.reader.elementSize;
  reader_39.reader._47_1_ = orig_4.reader._39_1_;
  checkList<capnp::List<unsigned_long,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_long,_(capnp::Kind)0>_>
            (reader_39,expected_19);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_3750,(Builder *)auStack_128);
  Text::Reader::Reader((Reader *)&orig_5.reader.nestingLimit,"foo");
  Text::Reader::Reader(&local_3780,"bar");
  Text::Reader::Reader(&local_3770,"baz");
  local_3760 = &orig_5.reader.nestingLimit;
  local_3758 = 3;
  list_04._M_len = 3;
  list_04._M_array = (iterator)local_3760;
  AnyPointer::Builder::setAs<capnp::List<capnp::Text,(capnp::Kind)1>>(&local_3750,list_04);
  capnproto_test::capnp::test::TestAnyPointer::Builder::asReader(&local_3810,(Builder *)auStack_128)
  ;
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField(&local_37e0,&local_3810);
  AnyPointer::Reader::getAs<capnp::List<capnp::Text,(capnp::Kind)1>>
            ((ReaderFor<capnp::List<capnp::Text,_(capnp::Kind)1>_> *)auStack_37c0,&local_37e0);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_3850,(Builder *)auStack_128);
  AnyPointer::Builder::getAs<capnp::List<capnp::Void,(capnp::Kind)0>>(&local_3838,&local_3850);
  local_3860 = local_3863;
  local_3858 = 3;
  expected_18._M_len = 3;
  expected_18._M_array = local_3860;
  reader_15.builder.capTable = local_3838.builder.capTable;
  reader_15.builder.segment = local_3838.builder.segment;
  reader_15.builder.ptr = local_3838.builder.ptr;
  reader_15.builder.elementCount = local_3838.builder.elementCount;
  reader_15.builder.step = local_3838.builder.step;
  reader_15.builder.structDataSize = local_3838.builder.structDataSize;
  reader_15.builder.structPointerCount = local_3838.builder.structPointerCount;
  reader_15.builder.elementSize = local_3838.builder.elementSize;
  reader_15.builder._39_1_ = local_3838.builder._39_1_;
  checkList<capnp::List<capnp::Void,_(capnp::Kind)0>::Builder,_capnp::List<capnp::Void,_(capnp::Kind)0>,_false>
            (reader_15,expected_18);
  puStack_39d0 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__27>
            (&local_39c8,(kj *)&stack0xffffffffffffc630,func_26);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_39c8,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_39c8);
  func_27 = extraout_RDX_44;
  if (!bVar1) {
    local_39d1 = kj::_::Debug::shouldLog(ERROR);
    func_27 = extraout_RDX_45;
    while (local_39d1 != false) {
      kj::_::Debug::log<char_const(&)[112]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x4b4,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
                 ,(char (*) [112])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
                );
      func_27 = extraout_RDX_46;
      local_39d1 = false;
    }
  }
  puStack_3b40 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__28>
            (&local_3b38,(kj *)&stack0xffffffffffffc4c0,func_27);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_3b38,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_3b38);
  func_28 = extraout_RDX_47;
  if (!bVar1) {
    local_3b41 = kj::_::Debug::shouldLog(ERROR);
    func_28 = extraout_RDX_48;
    while (local_3b41 != false) {
      kj::_::Debug::log<char_const(&)[115]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x4b5,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint8_t>>(); }) != nullptr\""
                 ,(char (*) [115])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint8_t>>(); }) != nullptr"
                );
      func_28 = extraout_RDX_49;
      local_3b41 = false;
    }
  }
  puStack_3cb0 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__29>
            (&local_3ca8,(kj *)&stack0xffffffffffffc350,func_28);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_3ca8,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_3ca8);
  func_29 = extraout_RDX_50;
  if (!bVar1) {
    local_3cb1 = kj::_::Debug::shouldLog(ERROR);
    func_29 = extraout_RDX_51;
    while (local_3cb1 != false) {
      kj::_::Debug::log<char_const(&)[116]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x4b6,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint16_t>>(); }) != nullptr\""
                 ,(char (*) [116])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint16_t>>(); }) != nullptr"
                );
      func_29 = extraout_RDX_52;
      local_3cb1 = false;
    }
  }
  puStack_3e20 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__30>
            (&local_3e18,(kj *)&stack0xffffffffffffc1e0,func_29);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_3e18,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_3e18);
  func_30 = extraout_RDX_53;
  if (!bVar1) {
    local_3e21 = kj::_::Debug::shouldLog(ERROR);
    func_30 = extraout_RDX_54;
    while (local_3e21 != false) {
      kj::_::Debug::log<char_const(&)[116]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x4b7,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr\""
                 ,(char (*) [116])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr"
                );
      func_30 = extraout_RDX_55;
      local_3e21 = false;
    }
  }
  puStack_3f90 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__31>
            (&local_3f88,(kj *)&stack0xffffffffffffc070,func_30);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_3f88,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_3f88);
  if (!bVar1) {
    local_3f91 = kj::_::Debug::shouldLog(ERROR);
    while (local_3f91 != false) {
      kj::_::Debug::log<char_const(&)[116]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x4b8,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr\""
                 ,(char (*) [116])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr"
                );
      local_3f91 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_3fd8,(Builder *)auStack_128);
  AnyPointer::Builder::getAs<capnp::List<capnp::Text,(capnp::Kind)1>>(&local_3fc0,&local_3fd8);
  Text::Reader::Reader(&local_4018,"foo");
  Text::Reader::Reader(&local_4008,"bar");
  Text::Reader::Reader(&local_3ff8,"baz");
  local_3fe8 = &local_4018;
  local_3fe0 = 3;
  expected_17._M_len = 3;
  expected_17._M_array = local_3fe8;
  reader_16.builder.capTable = local_3fc0.builder.capTable;
  reader_16.builder.segment = local_3fc0.builder.segment;
  reader_16.builder.ptr = local_3fc0.builder.ptr;
  reader_16.builder.elementCount = local_3fc0.builder.elementCount;
  reader_16.builder.step = local_3fc0.builder.step;
  reader_16.builder.structDataSize = local_3fc0.builder.structDataSize;
  reader_16.builder.structPointerCount = local_3fc0.builder.structPointerCount;
  reader_16.builder.elementSize = local_3fc0.builder.elementSize;
  reader_16.builder._39_1_ = local_3fc0.builder._39_1_;
  checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Builder,_capnp::List<capnp::Text,_(capnp::Kind)1>,_false>
            (reader_16,expected_17);
  local_4028 = orig_5.reader.elementCount;
  BStack_4024 = orig_5.reader.step;
  SStack_4020 = orig_5.reader.structDataSize;
  SStack_401c = orig_5.reader.structPointerCount;
  EStack_401a = orig_5.reader.elementSize;
  uStack_4019 = orig_5.reader._39_1_;
  local_4038 = orig_5.reader.capTable;
  pbStack_4030 = orig_5.reader.ptr;
  local_4048 = (SegmentReader *)auStack_37c0;
  pSStack_4040 = orig_5.reader.segment;
  Text::Reader::Reader(&local_4088,"foo");
  Text::Reader::Reader(&local_4078,"bar");
  Text::Reader::Reader(&local_4068,"baz");
  local_4058 = &local_4088;
  local_4050 = 3;
  expected_16._M_len = 3;
  expected_16._M_array = local_4058;
  reader_40.reader.capTable = (CapTableReader *)pSStack_4040;
  reader_40.reader.segment = local_4048;
  reader_40.reader.ptr = (byte *)local_4038;
  reader_40.reader._24_8_ = pbStack_4030;
  reader_40.reader._32_8_ = _local_4028;
  reader_40.reader.nestingLimit = SStack_4020;
  reader_40.reader._44_2_ = SStack_401c;
  reader_40.reader._46_1_ = EStack_401a;
  reader_40.reader._47_1_ = uStack_4019;
  checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Reader,_capnp::List<capnp::Text,_(capnp::Kind)1>_>
            (reader_40,expected_16);
  local_4098 = root._builder.pointers;
  local_40a8 = root._builder.capTable;
  pvStack_40a0 = root._builder.data;
  local_40b8 = (SegmentBuilder *)auStack_128;
  pSStack_40b0 = root._builder.segment;
  local_40e8 = 0;
  uStack_40e0 = 0;
  local_40d8 = 0;
  local_40c8 = (anon_unknown_0 *)&local_40e8;
  local_40c0 = (iterator)0x3;
  Text::Reader::Reader(&local_4128,"foo");
  Text::Reader::Reader(&local_4118,"bar");
  Text::Reader::Reader(&local_4108,"baz");
  local_40f8 = &local_4128;
  local_40f0 = 3;
  root_05._builder.capTable = (CapTableBuilder *)pSStack_40b0;
  root_05._builder.segment = local_40b8;
  root_05._builder.data = local_40a8;
  root_05._builder.pointers = (WirePointer *)pvStack_40a0;
  root_05._builder._32_8_ = local_4098;
  expectedData_04._M_len = (size_type)local_40f8;
  expectedData_04._M_array = local_40c0;
  expectedPointers_04._M_len = (size_type)local_4098;
  expectedPointers_04._M_array = (iterator)0x3;
  pcVar5 = (char *)local_4098;
  checkUpgradedList(local_40c8,root_05,expectedData_04,expectedPointers_04);
  local_4138 = orig_5.reader.elementCount;
  BStack_4134 = orig_5.reader.step;
  SStack_4130 = orig_5.reader.structDataSize;
  SStack_412c = orig_5.reader.structPointerCount;
  EStack_412a = orig_5.reader.elementSize;
  uStack_4129 = orig_5.reader._39_1_;
  local_4148 = orig_5.reader.capTable;
  pbStack_4140 = orig_5.reader.ptr;
  local_4158 = (SegmentReader *)auStack_37c0;
  pSStack_4150 = orig_5.reader.segment;
  Text::Reader::Reader((Reader *)&l.builder.structDataSize,"");
  Text::Reader::Reader(&local_4188,"");
  Text::Reader::Reader(&local_4178,"");
  local_4168 = &l.builder.structDataSize;
  local_4160 = 3;
  expected_15._M_len = 3;
  expected_15._M_array = (iterator)local_4168;
  reader_41.reader.capTable = (CapTableReader *)pSStack_4150;
  reader_41.reader.segment = local_4158;
  reader_41.reader.ptr = (byte *)local_4148;
  reader_41.reader._24_8_ = pbStack_4140;
  reader_41.reader._32_8_ = _local_4138;
  reader_41.reader.nestingLimit = SStack_4130;
  reader_41.reader._44_2_ = SStack_412c;
  reader_41.reader._46_1_ = EStack_412a;
  reader_41.reader._47_1_ = uStack_4129;
  checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Reader,_capnp::List<capnp::Text,_(capnp::Kind)1>_>
            (reader_41,expected_15);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_41d8,(Builder *)auStack_128);
  AnyPointer::Builder::
  initAs<capnp::List<capnproto_test::capnp::test::TestOldVersion,(capnp::Kind)3>>
            ((BuilderFor<capnp::List<capnproto_test::capnp::test::TestOldVersion>_> *)local_41c0,
             &local_41d8,3);
  List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Builder::operator[]
            (&local_4200,(Builder *)local_41c0,0);
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld1(&local_4200,0x1234567890abcdef);
  List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Builder::operator[]
            (&local_4228,(Builder *)local_41c0,1);
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld1(&local_4228,0x234567890abcdef1);
  List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Builder::operator[]
            (&local_4250,(Builder *)local_41c0,2);
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld1(&local_4250,0x34567890abcdef12);
  List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Builder::operator[]
            (&local_4278,(Builder *)local_41c0,0);
  Text::Reader::Reader((Reader *)&local_4288,"foo");
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld2(&local_4278,(Reader)local_4288);
  List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Builder::operator[]
            (&local_42b0,(Builder *)local_41c0,1);
  Text::Reader::Reader((Reader *)&local_42c0,"bar");
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld2(&local_42b0,(Reader)local_42c0);
  List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Builder::operator[]
            (&local_42e8,(Builder *)local_41c0,2);
  Text::Reader::Reader((Reader *)&orig_6.reader.nestingLimit,"baz");
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld2
            (&local_42e8,(Reader)stack0xffffffffffffbd08);
  capnproto_test::capnp::test::TestAnyPointer::Builder::asReader(&local_4378,(Builder *)auStack_128)
  ;
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField(&local_4348,&local_4378);
  AnyPointer::Reader::getAs<capnp::List<capnproto_test::capnp::test::TestOldVersion,(capnp::Kind)3>>
            ((ReaderFor<capnp::List<capnproto_test::capnp::test::TestOldVersion>_> *)auStack_4328,
             &local_4348);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_43b8,(Builder *)auStack_128);
  AnyPointer::Builder::getAs<capnp::List<capnp::Void,(capnp::Kind)0>>(&local_43a0,&local_43b8);
  local_43c8 = local_43cb;
  local_43c0 = 3;
  expected_14._M_len = 3;
  expected_14._M_array = local_43c8;
  reader_17.builder.capTable = local_43a0.builder.capTable;
  reader_17.builder.segment = local_43a0.builder.segment;
  reader_17.builder.ptr = local_43a0.builder.ptr;
  reader_17.builder.elementCount = local_43a0.builder.elementCount;
  reader_17.builder.step = local_43a0.builder.step;
  reader_17.builder.structDataSize = local_43a0.builder.structDataSize;
  reader_17.builder.structPointerCount = local_43a0.builder.structPointerCount;
  reader_17.builder.elementSize = local_43a0.builder.elementSize;
  reader_17.builder._39_1_ = local_43a0.builder._39_1_;
  checkList<capnp::List<capnp::Void,_(capnp::Kind)0>::Builder,_capnp::List<capnp::Void,_(capnp::Kind)0>,_false>
            (reader_17,expected_14);
  puStack_4538 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__32>
            (&local_4530,(kj *)&stack0xffffffffffffbac8,func_31);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_4530,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_4530);
  if (!bVar1) {
    local_4539 = kj::_::Debug::shouldLog(ERROR);
    while (local_4539 != false) {
      pcVar5 = 
      "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
      ;
      kj::_::Debug::log<char_const(&)[112]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x4cf,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
                 ,(char (*) [112])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
                );
      local_4539 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_4580,(Builder *)auStack_128);
  AnyPointer::Builder::getAs<capnp::List<unsigned_char,(capnp::Kind)0>>(&local_4568,&local_4580);
  local_4593[0] = 0xef;
  local_4593[1] = 0xf1;
  local_4593[2] = 0x12;
  local_4590 = local_4593;
  local_4588 = 3;
  expected_13._M_len = 3;
  expected_13._M_array = local_4590;
  reader_18.builder.capTable = local_4568.builder.capTable;
  reader_18.builder.segment = local_4568.builder.segment;
  reader_18.builder.ptr = local_4568.builder.ptr;
  reader_18.builder.elementCount = local_4568.builder.elementCount;
  reader_18.builder.step = local_4568.builder.step;
  reader_18.builder.structDataSize = local_4568.builder.structDataSize;
  reader_18.builder.structPointerCount = local_4568.builder.structPointerCount;
  reader_18.builder.elementSize = local_4568.builder.elementSize;
  reader_18.builder._39_1_ = local_4568.builder._39_1_;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_char,_(capnp::Kind)0>,_false>
            (reader_18,expected_13);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_45d8,(Builder *)auStack_128);
  AnyPointer::Builder::getAs<capnp::List<unsigned_short,(capnp::Kind)0>>(&local_45c0,&local_45d8);
  local_45ee[0] = 0xcdef;
  local_45ee[1] = 0xdef1;
  local_45ee[2] = 0xef12;
  local_45e8 = local_45ee;
  local_45e0 = 3;
  expected_12._M_len = 3;
  expected_12._M_array = local_45e8;
  reader_19.builder.capTable = local_45c0.builder.capTable;
  reader_19.builder.segment = local_45c0.builder.segment;
  reader_19.builder.ptr = local_45c0.builder.ptr;
  reader_19.builder.elementCount = local_45c0.builder.elementCount;
  reader_19.builder.step = local_45c0.builder.step;
  reader_19.builder.structDataSize = local_45c0.builder.structDataSize;
  reader_19.builder.structPointerCount = local_45c0.builder.structPointerCount;
  reader_19.builder.elementSize = local_45c0.builder.elementSize;
  reader_19.builder._39_1_ = local_45c0.builder._39_1_;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_short,_(capnp::Kind)0>,_false>
            (reader_19,expected_12);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_4630,(Builder *)auStack_128);
  AnyPointer::Builder::getAs<capnp::List<unsigned_int,(capnp::Kind)0>>(&local_4618,&local_4630);
  local_464c[0] = 0x90abcdef;
  local_464c[1] = 0xabcdef1;
  local_464c[2] = 0xabcdef12;
  local_4640 = local_464c;
  local_4638 = 3;
  expected_11._M_len = 3;
  expected_11._M_array = local_4640;
  reader_20.builder.capTable = local_4618.builder.capTable;
  reader_20.builder.segment = local_4618.builder.segment;
  reader_20.builder.ptr = local_4618.builder.ptr;
  reader_20.builder.elementCount = local_4618.builder.elementCount;
  reader_20.builder.step = local_4618.builder.step;
  reader_20.builder.structDataSize = local_4618.builder.structDataSize;
  reader_20.builder.structPointerCount = local_4618.builder.structPointerCount;
  reader_20.builder.elementSize = local_4618.builder.elementSize;
  reader_20.builder._39_1_ = local_4618.builder._39_1_;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_int,_(capnp::Kind)0>,_false>
            (reader_20,expected_11);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_4690,(Builder *)auStack_128);
  AnyPointer::Builder::getAs<capnp::List<unsigned_long,(capnp::Kind)0>>(&local_4678,&local_4690);
  local_46b8[0] = 0x1234567890abcdef;
  local_46b8[1] = 0x234567890abcdef1;
  local_46b8[2] = 0x34567890abcdef12;
  local_46a0 = local_46b8;
  local_4698 = 3;
  expected_10._M_len = 3;
  expected_10._M_array = local_46a0;
  reader_21.builder.capTable = local_4678.builder.capTable;
  reader_21.builder.segment = local_4678.builder.segment;
  reader_21.builder.ptr = local_4678.builder.ptr;
  reader_21.builder.elementCount = local_4678.builder.elementCount;
  reader_21.builder.step = local_4678.builder.step;
  reader_21.builder.structDataSize = local_4678.builder.structDataSize;
  reader_21.builder.structPointerCount = local_4678.builder.structPointerCount;
  reader_21.builder.elementSize = local_4678.builder.elementSize;
  reader_21.builder._39_1_ = local_4678.builder._39_1_;
  checkList<capnp::List<unsigned_long,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_long,_(capnp::Kind)0>,_false>
            (reader_21,expected_10);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_46f8,(Builder *)auStack_128);
  AnyPointer::Builder::getAs<capnp::List<capnp::Text,(capnp::Kind)1>>(&local_46e0,&local_46f8);
  Text::Reader::Reader(&local_4738,"foo");
  Text::Reader::Reader(&local_4728,"bar");
  Text::Reader::Reader(&local_4718,"baz");
  local_4708 = &local_4738;
  local_4700 = 3;
  expected_09._M_len = 3;
  expected_09._M_array = local_4708;
  reader_22.builder.capTable = local_46e0.builder.capTable;
  reader_22.builder.segment = local_46e0.builder.segment;
  reader_22.builder.ptr = local_46e0.builder.ptr;
  reader_22.builder.elementCount = local_46e0.builder.elementCount;
  reader_22.builder.step = local_46e0.builder.step;
  reader_22.builder.structDataSize = local_46e0.builder.structDataSize;
  reader_22.builder.structPointerCount = local_46e0.builder.structPointerCount;
  reader_22.builder.elementSize = local_46e0.builder.elementSize;
  reader_22.builder._39_1_ = local_46e0.builder._39_1_;
  checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Builder,_capnp::List<capnp::Text,_(capnp::Kind)1>,_false>
            (reader_22,expected_09);
  local_4748 = orig_6.reader.elementCount;
  BStack_4744 = orig_6.reader.step;
  SStack_4740 = orig_6.reader.structDataSize;
  SStack_473c = orig_6.reader.structPointerCount;
  EStack_473a = orig_6.reader.elementSize;
  uStack_4739 = orig_6.reader._39_1_;
  local_4758 = orig_6.reader.capTable;
  pbStack_4750 = orig_6.reader.ptr;
  local_4768 = (SegmentReader *)auStack_4328;
  pSStack_4760 = orig_6.reader.segment;
  local_4788 = 0x34567890abcdef12;
  local_4798 = 0x1234567890abcdef;
  uStack_4790 = 0x234567890abcdef1;
  local_4778 = (_ *)&local_4798;
  local_4770 = (iterator)0x3;
  Text::Reader::Reader(&local_47d8,"foo");
  Text::Reader::Reader(&local_47c8,"bar");
  Text::Reader::Reader(&local_47b8,"baz");
  local_47a8 = &local_47d8;
  local_47a0 = 3;
  reader_42.reader.capTable = (CapTableReader *)pSStack_4760;
  reader_42.reader.segment = local_4768;
  reader_42.reader.ptr = (byte *)local_4758;
  reader_42.reader._24_8_ = pbStack_4750;
  reader_42.reader._32_8_ = _local_4748;
  reader_42.reader.nestingLimit = SStack_4740;
  reader_42.reader._44_2_ = SStack_473c;
  reader_42.reader._46_1_ = EStack_473a;
  reader_42.reader._47_1_ = uStack_4739;
  expectedData_05._M_len = (size_type)local_47a8;
  expectedData_05._M_array = local_4770;
  expectedPointers_05._M_len = (size_type)pcVar5;
  expectedPointers_05._M_array = (iterator)0x3;
  checkList(local_4778,reader_42,expectedData_05,expectedPointers_05);
  local_47e8 = root._builder.pointers;
  local_47f8 = root._builder.capTable;
  pvStack_47f0 = root._builder.data;
  local_4808 = (SegmentBuilder *)auStack_128;
  pSStack_4800 = root._builder.segment;
  local_4828 = 0x34567890abcdef12;
  local_4838 = 0x1234567890abcdef;
  uStack_4830 = 0x234567890abcdef1;
  local_4818 = (anon_unknown_0 *)&local_4838;
  local_4810 = (iterator)0x3;
  Text::Reader::Reader(&local_4878,"foo");
  Text::Reader::Reader(&local_4868,"bar");
  Text::Reader::Reader(&local_4858,"baz");
  local_4848 = &local_4878;
  local_4840 = 3;
  root_06._builder.capTable = (CapTableBuilder *)pSStack_4800;
  root_06._builder.segment = local_4808;
  root_06._builder.data = local_47f8;
  root_06._builder.pointers = (WirePointer *)pvStack_47f0;
  root_06._builder._32_8_ = local_47e8;
  expectedData_06._M_len = (size_type)local_4848;
  expectedData_06._M_array = local_4810;
  expectedPointers_06._M_len = (size_type)local_47e8;
  expectedPointers_06._M_array = (iterator)0x3;
  pWVar6 = local_47e8;
  checkUpgradedList(local_4818,root_06,expectedData_06,expectedPointers_06);
  local_4888 = orig_6.reader.elementCount;
  BStack_4884 = orig_6.reader.step;
  SStack_4880 = orig_6.reader.structDataSize;
  SStack_487c = orig_6.reader.structPointerCount;
  EStack_487a = orig_6.reader.elementSize;
  uStack_4879 = orig_6.reader._39_1_;
  local_4898 = orig_6.reader.capTable;
  pbStack_4890 = orig_6.reader.ptr;
  local_48a8 = (SegmentReader *)auStack_4328;
  pSStack_48a0 = orig_6.reader.segment;
  local_48d8 = 0;
  uStack_48d0 = 0;
  local_48c8 = 0;
  local_48b8 = (_ *)&local_48d8;
  local_48b0 = (iterator)0x3;
  Text::Reader::Reader(&local_4918,"");
  Text::Reader::Reader(&local_4908,"");
  Text::Reader::Reader(&local_48f8,"");
  local_48e8 = &local_4918;
  local_48e0 = 3;
  reader_43.reader.capTable = (CapTableReader *)pSStack_48a0;
  reader_43.reader.segment = local_48a8;
  reader_43.reader.ptr = (byte *)local_4898;
  reader_43.reader._24_8_ = pbStack_4890;
  reader_43.reader._32_8_ = _local_4888;
  reader_43.reader.nestingLimit = SStack_4880;
  reader_43.reader._44_2_ = SStack_487c;
  reader_43.reader._46_1_ = EStack_487a;
  reader_43.reader._47_1_ = uStack_4879;
  expectedData_07._M_len = (size_type)local_48e8;
  expectedData_07._M_array = local_48b0;
  expectedPointers_07._M_len = (size_type)pWVar6;
  expectedPointers_07._M_array = (iterator)0x3;
  checkList(local_48b8,reader_43,expectedData_07,expectedPointers_07);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_4930,(Builder *)auStack_128);
  orig_7.reader.nestingLimit._0_2_ = 0xc;
  orig_7.reader.nestingLimit._2_2_ = 0x22;
  orig_7.reader._44_2_ = 0x38;
  orig_7.reader._46_2_ = 0x4e;
  list_03._M_len = 4;
  list_03._M_array = (iterator)&orig_7.reader.nestingLimit;
  AnyPointer::Builder::setAs<capnp::List<unsigned_short,(capnp::Kind)0>>(&local_4930,list_03);
  capnproto_test::capnp::test::TestAnyPointer::Builder::asReader(&local_49c8,(Builder *)auStack_128)
  ;
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField(&local_4998,&local_49c8);
  AnyPointer::Reader::getAs<capnp::List<unsigned_short,(capnp::Kind)0>>
            ((ReaderFor<capnp::List<unsigned_short,_(capnp::Kind)0>_> *)auStack_4978,&local_4998);
  l_1.builder.structDataSize._0_2_ = 0xc;
  l_1.builder.structDataSize._2_2_ = 0x22;
  l_1.builder.structPointerCount = 0x38;
  l_1.builder.elementSize = 0x4e;
  l_1.builder._39_1_ = 0;
  expected_08._M_len = 4;
  expected_08._M_array = (iterator)&l_1.builder.structDataSize;
  reader_44.reader.capTable = (CapTableReader *)orig_7.reader.segment;
  reader_44.reader.segment = (SegmentReader *)auStack_4978;
  reader_44.reader.ptr = (byte *)orig_7.reader.capTable;
  reader_44.reader._24_8_ = orig_7.reader.ptr;
  reader_44.reader._32_8_ = orig_7.reader._24_8_;
  reader_44.reader.nestingLimit = orig_7.reader.structDataSize;
  reader_44.reader._44_2_ = orig_7.reader.structPointerCount;
  reader_44.reader._46_1_ = orig_7.reader.elementSize;
  reader_44.reader._47_1_ = orig_7.reader._39_1_;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_short,_(capnp::Kind)0>_>
            (reader_44,expected_08);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_4a50,(Builder *)auStack_128);
  AnyPointer::Builder::
  getAs<capnp::List<capnproto_test::capnp::test::TestLists::Struct32,(capnp::Kind)3>>
            ((BuilderFor<capnp::List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>_>
              *)local_4a38,&local_4a50);
  f.exception._0_2_ = 0;
  f.exception._2_2_ = 0;
  f.exception._4_2_ = 0;
  f.exception._6_2_ = 0;
  expected_07._M_len = 4;
  expected_07._M_array = (iterator)&f;
  reader_45.reader.capTable = (CapTableReader *)orig_7.reader.segment;
  reader_45.reader.segment = (SegmentReader *)auStack_4978;
  reader_45.reader.ptr = (byte *)orig_7.reader.capTable;
  reader_45.reader._24_8_ = orig_7.reader.ptr;
  reader_45.reader._32_8_ = orig_7.reader._24_8_;
  reader_45.reader.nestingLimit = orig_7.reader.structDataSize;
  reader_45.reader._44_2_ = orig_7.reader.structPointerCount;
  reader_45.reader._46_1_ = orig_7.reader.elementSize;
  reader_45.reader._47_1_ = orig_7.reader._39_1_;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_short,_(capnp::Kind)0>_>
            (reader_45,expected_07);
  uVar3 = List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Builder::size
                    ((Builder *)local_4a38);
  if (uVar3 != 4) {
    local_4aac = 4;
    local_4ab0 = List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Builder::
                 size((Builder *)local_4a38);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_4aa8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x4ea,FAILED,"(4u) == (l.size())","4u, l.size()",&local_4aac,&local_4ab0);
    kj::_::Debug::Fault::fatal(&local_4aa8);
  }
  List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)local_4ad8,(Builder *)local_4a38,0);
  uVar4 = capnproto_test::capnp::test::TestLists::Struct32::Builder::getF((Builder *)local_4ad8);
  if (uVar4 != 0xc) {
    local_4ad9 = kj::_::Debug::shouldLog(ERROR);
    while (local_4ad9 != false) {
      local_4ae0 = 0xc;
      List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Builder::operator[]
                (&local_4b10,(Builder *)local_4a38,0);
      local_4ae4 = capnproto_test::capnp::test::TestLists::Struct32::Builder::getF(&local_4b10);
      kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x4eb,ERROR,"\"failed: expected \" \"(12u) == (l[0].getF())\", 12u, l[0].getF()",
                 (char (*) [40])"failed: expected (12u) == (l[0].getF())",&local_4ae0,&local_4ae4);
      local_4ad9 = false;
    }
  }
  List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)local_4b38,(Builder *)local_4a38,1);
  uVar4 = capnproto_test::capnp::test::TestLists::Struct32::Builder::getF((Builder *)local_4b38);
  if (uVar4 != 0x22) {
    local_4b39 = kj::_::Debug::shouldLog(ERROR);
    while (local_4b39 != false) {
      local_4b40 = 0x22;
      List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Builder::operator[]
                (&local_4b70,(Builder *)local_4a38,1);
      local_4b44 = capnproto_test::capnp::test::TestLists::Struct32::Builder::getF(&local_4b70);
      kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x4ec,ERROR,"\"failed: expected \" \"(34u) == (l[1].getF())\", 34u, l[1].getF()",
                 (char (*) [40])"failed: expected (34u) == (l[1].getF())",&local_4b40,&local_4b44);
      local_4b39 = false;
    }
  }
  List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)local_4b98,(Builder *)local_4a38,2);
  uVar4 = capnproto_test::capnp::test::TestLists::Struct32::Builder::getF((Builder *)local_4b98);
  if (uVar4 != 0x38) {
    local_4b99 = kj::_::Debug::shouldLog(ERROR);
    while (local_4b99 != false) {
      local_4ba0 = 0x38;
      List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Builder::operator[]
                (&local_4bd0,(Builder *)local_4a38,2);
      local_4ba4 = capnproto_test::capnp::test::TestLists::Struct32::Builder::getF(&local_4bd0);
      kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x4ed,ERROR,"\"failed: expected \" \"(56u) == (l[2].getF())\", 56u, l[2].getF()",
                 (char (*) [40])"failed: expected (56u) == (l[2].getF())",&local_4ba0,&local_4ba4);
      local_4b99 = false;
    }
  }
  List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)local_4bf8,(Builder *)local_4a38,3);
  uVar4 = capnproto_test::capnp::test::TestLists::Struct32::Builder::getF((Builder *)local_4bf8);
  if (uVar4 != 0x4e) {
    local_4bf9 = kj::_::Debug::shouldLog(ERROR);
    while (local_4bf9 != false) {
      local_4c00 = 0x4e;
      List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Builder::operator[]
                (&local_4c30,(Builder *)local_4a38,3);
      local_4c04 = capnproto_test::capnp::test::TestLists::Struct32::Builder::getF(&local_4c30);
      kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x4ee,ERROR,"\"failed: expected \" \"(78u) == (l[3].getF())\", 78u, l[3].getF()",
                 (char (*) [40])"failed: expected (78u) == (l[3].getF())",&local_4c00,&local_4c04);
      local_4bf9 = false;
    }
  }
  List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Builder::operator[]
            (&local_4c58,(Builder *)local_4a38,0);
  capnproto_test::capnp::test::TestLists::Struct32::Builder::setF(&local_4c58,0x65ac1235);
  List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Builder::operator[]
            (&local_4c80,(Builder *)local_4a38,1);
  capnproto_test::capnp::test::TestLists::Struct32::Builder::setF(&local_4c80,0x13f12879);
  List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Builder::operator[]
            (&local_4ca8,(Builder *)local_4a38,2);
  capnproto_test::capnp::test::TestLists::Struct32::Builder::setF(&local_4ca8,0x33423082);
  List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Builder::operator[]
            (&local_4cd0,(Builder *)local_4a38,3);
  capnproto_test::capnp::test::TestLists::Struct32::Builder::setF(&local_4cd0,0x12988948);
  puStack_4e38 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__33>
            (&local_4e30,(kj *)&stack0xffffffffffffb1c8,func_32);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_4e30,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_4e30);
  if (!bVar1) {
    local_4e39 = kj::_::Debug::shouldLog(ERROR);
    while (local_4e39 != false) {
      kj::_::Debug::log<char_const(&)[112]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x4f4,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
                 ,(char (*) [112])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
                );
      local_4e39 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_4e80,(Builder *)auStack_128);
  AnyPointer::Builder::getAs<capnp::List<unsigned_char,(capnp::Kind)0>>(&local_4e68,&local_4e80);
  local_4e94[0] = '5';
  local_4e94[1] = 0x79;
  local_4e94[2] = 0x82;
  local_4e94[3] = 0x48;
  local_4e90 = local_4e94;
  local_4e88 = 4;
  expected_06._M_len = 4;
  expected_06._M_array = local_4e90;
  reader_23.builder.capTable = local_4e68.builder.capTable;
  reader_23.builder.segment = local_4e68.builder.segment;
  reader_23.builder.ptr = local_4e68.builder.ptr;
  reader_23.builder.elementCount = local_4e68.builder.elementCount;
  reader_23.builder.step = local_4e68.builder.step;
  reader_23.builder.structDataSize = local_4e68.builder.structDataSize;
  reader_23.builder.structPointerCount = local_4e68.builder.structPointerCount;
  reader_23.builder.elementSize = local_4e68.builder.elementSize;
  reader_23.builder._39_1_ = local_4e68.builder._39_1_;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_char,_(capnp::Kind)0>,_false>
            (reader_23,expected_06);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_4ed8,(Builder *)auStack_128);
  AnyPointer::Builder::getAs<capnp::List<unsigned_short,(capnp::Kind)0>>(&local_4ec0,&local_4ed8);
  local_4ef0[0] = 0x1235;
  local_4ef0[1] = 0x2879;
  local_4ef0[2] = 0x3082;
  local_4ef0[3] = 0x8948;
  local_4ee8 = local_4ef0;
  local_4ee0 = 4;
  expected_05._M_len = 4;
  expected_05._M_array = local_4ee8;
  reader_24.builder.capTable = local_4ec0.builder.capTable;
  reader_24.builder.segment = local_4ec0.builder.segment;
  reader_24.builder.ptr = local_4ec0.builder.ptr;
  reader_24.builder.elementCount = local_4ec0.builder.elementCount;
  reader_24.builder.step = local_4ec0.builder.step;
  reader_24.builder.structDataSize = local_4ec0.builder.structDataSize;
  reader_24.builder.structPointerCount = local_4ec0.builder.structPointerCount;
  reader_24.builder.elementSize = local_4ec0.builder.elementSize;
  reader_24.builder._39_1_ = local_4ec0.builder._39_1_;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_short,_(capnp::Kind)0>,_false>
            (reader_24,expected_05);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_4f30,(Builder *)auStack_128);
  AnyPointer::Builder::getAs<capnp::List<unsigned_int,(capnp::Kind)0>>(&local_4f18,&local_4f30);
  local_4f50[0] = 0x65ac1235;
  local_4f50[1] = 0x13f12879;
  local_4f50[2] = 0x33423082;
  local_4f50[3] = 0x12988948;
  local_4f40 = local_4f50;
  local_4f38 = 4;
  expected_04._M_len = 4;
  expected_04._M_array = local_4f40;
  reader_25.builder.capTable = local_4f18.builder.capTable;
  reader_25.builder.segment = local_4f18.builder.segment;
  reader_25.builder.ptr = local_4f18.builder.ptr;
  reader_25.builder.elementCount = local_4f18.builder.elementCount;
  reader_25.builder.step = local_4f18.builder.step;
  reader_25.builder.structDataSize = local_4f18.builder.structDataSize;
  reader_25.builder.structPointerCount = local_4f18.builder.structPointerCount;
  reader_25.builder.elementSize = local_4f18.builder.elementSize;
  reader_25.builder._39_1_ = local_4f18.builder._39_1_;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_int,_(capnp::Kind)0>,_false>
            (reader_25,expected_04);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_4f90,(Builder *)auStack_128);
  AnyPointer::Builder::getAs<capnp::List<unsigned_long,(capnp::Kind)0>>(&local_4f78,&local_4f90);
  local_4fc8[2] = 0x33423082;
  local_4fc8[3] = 0x12988948;
  local_4fc8[0] = 0x65ac1235;
  local_4fc8[1] = 0x13f12879;
  local_4fa0 = local_4fc8;
  local_4f98 = 4;
  expected_03._M_len = 4;
  expected_03._M_array = local_4fa0;
  reader_26.builder.capTable = local_4f78.builder.capTable;
  reader_26.builder.segment = local_4f78.builder.segment;
  reader_26.builder.ptr = local_4f78.builder.ptr;
  reader_26.builder.elementCount = local_4f78.builder.elementCount;
  reader_26.builder.step = local_4f78.builder.step;
  reader_26.builder.structDataSize = local_4f78.builder.structDataSize;
  reader_26.builder.structPointerCount = local_4f78.builder.structPointerCount;
  reader_26.builder.elementSize = local_4f78.builder.elementSize;
  reader_26.builder._39_1_ = local_4f78.builder._39_1_;
  checkList<capnp::List<unsigned_long,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_long,_(capnp::Kind)0>,_false>
            (reader_26,expected_03);
  puStack_5130 = auStack_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__34>
            (&local_5128,(kj *)&stack0xffffffffffffaed0,func_33);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_5128,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_5128);
  if (!bVar1) {
    local_5131 = kj::_::Debug::shouldLog(ERROR);
    while (local_5131 != false) {
      kj::_::Debug::log<char_const(&)[112]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x4fb,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr\""
                 ,(char (*) [112])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr"
                );
      local_5131 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_5150,(Builder *)auStack_128);
  list_02._M_len = 4;
  list_02._M_array = (iterator)&l_2.builder.structPointerCount;
  AnyPointer::Builder::setAs<capnp::List<capnp::Void,(capnp::Kind)0>>(&local_5150,list_02);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)&f_1,(Builder *)auStack_128);
  AnyPointer::Builder::
  getAs<capnp::List<capnproto_test::capnp::test::TestLists::Struct16,(capnp::Kind)3>>
            ((BuilderFor<capnp::List<capnproto_test::capnp::test::TestLists::Struct16,_(capnp::Kind)3>_>
              *)local_5190,(Builder *)&f_1);
  uVar3 = List<capnproto_test::capnp::test::TestLists::Struct16,_(capnp::Kind)3>::Builder::size
                    ((Builder *)local_5190);
  if (uVar3 == 4) {
    List<capnproto_test::capnp::test::TestLists::Struct16,_(capnp::Kind)3>::Builder::operator[]
              ((Builder *)local_51e0,(Builder *)local_5190,0);
    uVar2 = capnproto_test::capnp::test::TestLists::Struct16::Builder::getF((Builder *)local_51e0);
    if (uVar2 != 0) {
      local_51e1 = kj::_::Debug::shouldLog(ERROR);
      while (local_51e1 != false) {
        local_51e8 = 0;
        List<capnproto_test::capnp::test::TestLists::Struct16,_(capnp::Kind)3>::Builder::operator[]
                  (&local_5218,(Builder *)local_5190,0);
        local_51ea = capnproto_test::capnp::test::TestLists::Struct16::Builder::getF(&local_5218);
        kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_short>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x502,ERROR,"\"failed: expected \" \"(0u) == (l[0].getF())\", 0u, l[0].getF()",
                   (char (*) [39])"failed: expected (0u) == (l[0].getF())",&local_51e8,&local_51ea);
        local_51e1 = false;
      }
    }
    List<capnproto_test::capnp::test::TestLists::Struct16,_(capnp::Kind)3>::Builder::operator[]
              ((Builder *)local_5240,(Builder *)local_5190,1);
    uVar2 = capnproto_test::capnp::test::TestLists::Struct16::Builder::getF((Builder *)local_5240);
    if (uVar2 != 0) {
      local_5241 = kj::_::Debug::shouldLog(ERROR);
      while (local_5241 != false) {
        local_5248 = 0;
        List<capnproto_test::capnp::test::TestLists::Struct16,_(capnp::Kind)3>::Builder::operator[]
                  (&local_5278,(Builder *)local_5190,1);
        local_524a = capnproto_test::capnp::test::TestLists::Struct16::Builder::getF(&local_5278);
        kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_short>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x503,ERROR,"\"failed: expected \" \"(0u) == (l[1].getF())\", 0u, l[1].getF()",
                   (char (*) [39])"failed: expected (0u) == (l[1].getF())",&local_5248,&local_524a);
        local_5241 = false;
      }
    }
    List<capnproto_test::capnp::test::TestLists::Struct16,_(capnp::Kind)3>::Builder::operator[]
              ((Builder *)local_52a0,(Builder *)local_5190,2);
    uVar2 = capnproto_test::capnp::test::TestLists::Struct16::Builder::getF((Builder *)local_52a0);
    if (uVar2 != 0) {
      local_52a1 = kj::_::Debug::shouldLog(ERROR);
      while (local_52a1 != false) {
        local_52a8 = 0;
        List<capnproto_test::capnp::test::TestLists::Struct16,_(capnp::Kind)3>::Builder::operator[]
                  (&local_52d8,(Builder *)local_5190,2);
        local_52aa = capnproto_test::capnp::test::TestLists::Struct16::Builder::getF(&local_52d8);
        kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_short>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x504,ERROR,"\"failed: expected \" \"(0u) == (l[2].getF())\", 0u, l[2].getF()",
                   (char (*) [39])"failed: expected (0u) == (l[2].getF())",&local_52a8,&local_52aa);
        local_52a1 = false;
      }
    }
    List<capnproto_test::capnp::test::TestLists::Struct16,_(capnp::Kind)3>::Builder::operator[]
              ((Builder *)local_5300,(Builder *)local_5190,3);
    uVar2 = capnproto_test::capnp::test::TestLists::Struct16::Builder::getF((Builder *)local_5300);
    if (uVar2 != 0) {
      local_5301 = kj::_::Debug::shouldLog(ERROR);
      while (local_5301 != false) {
        local_5308 = 0;
        List<capnproto_test::capnp::test::TestLists::Struct16,_(capnp::Kind)3>::Builder::operator[]
                  (&local_5338,(Builder *)local_5190,3);
        local_530a = capnproto_test::capnp::test::TestLists::Struct16::Builder::getF(&local_5338);
        kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_short>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x505,ERROR,"\"failed: expected \" \"(0u) == (l[3].getF())\", 0u, l[3].getF()",
                   (char (*) [39])"failed: expected (0u) == (l[3].getF())",&local_5308,&local_530a);
        local_5301 = false;
      }
    }
    List<capnproto_test::capnp::test::TestLists::Struct16,_(capnp::Kind)3>::Builder::operator[]
              (&local_5360,(Builder *)local_5190,0);
    capnproto_test::capnp::test::TestLists::Struct16::Builder::setF(&local_5360,0x311d);
    List<capnproto_test::capnp::test::TestLists::Struct16,_(capnp::Kind)3>::Builder::operator[]
              (&local_5388,(Builder *)local_5190,1);
    capnproto_test::capnp::test::TestLists::Struct16::Builder::setF(&local_5388,0xcb3);
    List<capnproto_test::capnp::test::TestLists::Struct16,_(capnp::Kind)3>::Builder::operator[]
              (&local_53b0,(Builder *)local_5190,2);
    capnproto_test::capnp::test::TestLists::Struct16::Builder::setF(&local_53b0,0x2416);
    List<capnproto_test::capnp::test::TestLists::Struct16,_(capnp::Kind)3>::Builder::operator[]
              (&local_53d8,(Builder *)local_5190,3);
    capnproto_test::capnp::test::TestLists::Struct16::Builder::setF(&local_53d8,0x16c8);
    puStack_5540 = auStack_128;
    kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__35>
              (&local_5538,(kj *)&stack0xffffffffffffaac0,func_34);
    bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_5538,(void *)0x0);
    kj::Maybe<kj::Exception>::~Maybe(&local_5538);
    if (!bVar1) {
      local_5541 = kj::_::Debug::shouldLog(ERROR);
      while (local_5541 != false) {
        kj::_::Debug::log<char_const(&)[112]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x50b,ERROR,
                   "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
                   ,(char (*) [112])
                    "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
                  );
        local_5541 = false;
      }
    }
    capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
              (&local_5588,(Builder *)auStack_128);
    AnyPointer::Builder::getAs<capnp::List<unsigned_short,(capnp::Kind)0>>(&local_5570,&local_5588);
    local_55a0[0] = 0x311d;
    local_55a0[1] = 0xcb3;
    local_55a0[2] = 0x2416;
    local_55a0[3] = 0x16c8;
    local_5598 = local_55a0;
    local_5590 = 4;
    expected_02._M_len = 4;
    expected_02._M_array = local_5598;
    reader_27.builder.capTable = local_5570.builder.capTable;
    reader_27.builder.segment = local_5570.builder.segment;
    reader_27.builder.ptr = local_5570.builder.ptr;
    reader_27.builder.elementCount = local_5570.builder.elementCount;
    reader_27.builder.step = local_5570.builder.step;
    reader_27.builder.structDataSize = local_5570.builder.structDataSize;
    reader_27.builder.structPointerCount = local_5570.builder.structPointerCount;
    reader_27.builder.elementSize = local_5570.builder.elementSize;
    reader_27.builder._39_1_ = local_5570.builder._39_1_;
    checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_short,_(capnp::Kind)0>,_false>
              (reader_27,expected_02);
    capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
              (&local_55e0,(Builder *)auStack_128);
    AnyPointer::Builder::getAs<capnp::List<unsigned_int,(capnp::Kind)0>>(&local_55c8,&local_55e0);
    local_5600[0] = 0x311d;
    local_5600[1] = 0xcb3;
    local_5600[2] = 0x2416;
    local_5600[3] = 0x16c8;
    local_55f0 = local_5600;
    local_55e8 = 4;
    expected_01._M_len = 4;
    expected_01._M_array = local_55f0;
    reader_28.builder.capTable = local_55c8.builder.capTable;
    reader_28.builder.segment = local_55c8.builder.segment;
    reader_28.builder.ptr = local_55c8.builder.ptr;
    reader_28.builder.elementCount = local_55c8.builder.elementCount;
    reader_28.builder.step = local_55c8.builder.step;
    reader_28.builder.structDataSize = local_55c8.builder.structDataSize;
    reader_28.builder.structPointerCount = local_55c8.builder.structPointerCount;
    reader_28.builder.elementSize = local_55c8.builder.elementSize;
    reader_28.builder._39_1_ = local_55c8.builder._39_1_;
    checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_int,_(capnp::Kind)0>,_false>
              (reader_28,expected_01);
    capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
              (&local_5640,(Builder *)auStack_128);
    AnyPointer::Builder::getAs<capnp::List<unsigned_long,(capnp::Kind)0>>(&local_5628,&local_5640);
    local_5678[2] = 0x2416;
    local_5678[3] = 0x16c8;
    local_5678[0] = 0x311d;
    local_5678[1] = 0xcb3;
    local_5650 = local_5678;
    local_5648 = 4;
    expected_00._M_len = 4;
    expected_00._M_array = local_5650;
    reader_29.builder.capTable = local_5628.builder.capTable;
    reader_29.builder.segment = local_5628.builder.segment;
    reader_29.builder.ptr = local_5628.builder.ptr;
    reader_29.builder.elementCount = local_5628.builder.elementCount;
    reader_29.builder.step = local_5628.builder.step;
    reader_29.builder.structDataSize = local_5628.builder.structDataSize;
    reader_29.builder.structPointerCount = local_5628.builder.structPointerCount;
    reader_29.builder.elementSize = local_5628.builder.elementSize;
    reader_29.builder._39_1_ = local_5628.builder._39_1_;
    checkList<capnp::List<unsigned_long,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_long,_(capnp::Kind)0>,_false>
              (reader_29,expected_00);
    puStack_57e0 = auStack_128;
    kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__36>
              (&local_57d8,(kj *)&stack0xffffffffffffa820,func_35);
    bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_57d8,(void *)0x0);
    kj::Maybe<kj::Exception>::~Maybe(&local_57d8);
    if (!bVar1) {
      local_57e1 = kj::_::Debug::shouldLog(ERROR);
      while (local_57e1 != false) {
        kj::_::Debug::log<char_const(&)[112]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x50f,ERROR,
                   "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr\""
                   ,(char (*) [112])
                    "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr"
                  );
        local_57e1 = false;
      }
    }
    capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
              (&local_5800,(Builder *)auStack_128);
    list_01._M_len = 4;
    list_01._M_array = (iterator)&l_3.builder.structPointerCount;
    AnyPointer::Builder::setAs<capnp::List<capnp::Void,(capnp::Kind)0>>(&local_5800,list_01);
    capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
              ((Builder *)&f_2,(Builder *)auStack_128);
    AnyPointer::Builder::
    getAs<capnp::List<capnproto_test::capnp::test::TestLists::StructP,(capnp::Kind)3>>
              ((BuilderFor<capnp::List<capnproto_test::capnp::test::TestLists::StructP,_(capnp::Kind)3>_>
                *)local_5840,(Builder *)&f_2);
    uVar3 = List<capnproto_test::capnp::test::TestLists::StructP,_(capnp::Kind)3>::Builder::size
                      ((Builder *)local_5840);
    if (uVar3 != 4) {
      local_5864 = 4;
      local_5868 = List<capnproto_test::capnp::test::TestLists::StructP,_(capnp::Kind)3>::Builder::
                   size((Builder *)local_5840);
      kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
                (&local_5860,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x515,FAILED,"(4u) == (l.size())","4u, l.size()",&local_5864,&local_5868);
      kj::_::Debug::Fault::fatal(&local_5860);
    }
    List<capnproto_test::capnp::test::TestLists::StructP,_(capnp::Kind)3>::Builder::operator[]
              ((Builder *)local_58a8,(Builder *)local_5840,0);
    capnproto_test::capnp::test::TestLists::StructP::Builder::getF
              (&local_5880,(Builder *)local_58a8);
    bVar1 = capnp::operator==("",&local_5880);
    if (!bVar1) {
      local_58a9 = kj::_::Debug::shouldLog(ERROR);
      while (local_58a9 != false) {
        List<capnproto_test::capnp::test::TestLists::StructP,_(capnp::Kind)3>::Builder::operator[]
                  (&local_58f0,(Builder *)local_5840,0);
        capnproto_test::capnp::test::TestLists::StructP::Builder::getF(&local_58c8,&local_58f0);
        kj::_::Debug::log<char_const(&)[39],char_const(&)[1],capnp::Text::Builder>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x516,ERROR,
                   "\"failed: expected \" \"(\\\"\\\") == (l[0].getF())\", \"\", l[0].getF()",
                   (char (*) [39])"failed: expected (\"\") == (l[0].getF())",(char (*) [1])0x51fdd1,
                   &local_58c8);
        local_58a9 = false;
      }
    }
    List<capnproto_test::capnp::test::TestLists::StructP,_(capnp::Kind)3>::Builder::operator[]
              ((Builder *)local_5930,(Builder *)local_5840,1);
    capnproto_test::capnp::test::TestLists::StructP::Builder::getF
              (&local_5908,(Builder *)local_5930);
    bVar1 = capnp::operator==("",&local_5908);
    if (!bVar1) {
      local_5931 = kj::_::Debug::shouldLog(ERROR);
      while (local_5931 != false) {
        List<capnproto_test::capnp::test::TestLists::StructP,_(capnp::Kind)3>::Builder::operator[]
                  (&local_5978,(Builder *)local_5840,1);
        capnproto_test::capnp::test::TestLists::StructP::Builder::getF(&local_5950,&local_5978);
        kj::_::Debug::log<char_const(&)[39],char_const(&)[1],capnp::Text::Builder>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x517,ERROR,
                   "\"failed: expected \" \"(\\\"\\\") == (l[1].getF())\", \"\", l[1].getF()",
                   (char (*) [39])"failed: expected (\"\") == (l[1].getF())",(char (*) [1])0x51fdd1,
                   &local_5950);
        local_5931 = false;
      }
    }
    List<capnproto_test::capnp::test::TestLists::StructP,_(capnp::Kind)3>::Builder::operator[]
              ((Builder *)local_59b8,(Builder *)local_5840,2);
    capnproto_test::capnp::test::TestLists::StructP::Builder::getF
              (&local_5990,(Builder *)local_59b8);
    bVar1 = capnp::operator==("",&local_5990);
    if (!bVar1) {
      local_59b9 = kj::_::Debug::shouldLog(ERROR);
      while (local_59b9 != false) {
        List<capnproto_test::capnp::test::TestLists::StructP,_(capnp::Kind)3>::Builder::operator[]
                  (&local_5a00,(Builder *)local_5840,2);
        capnproto_test::capnp::test::TestLists::StructP::Builder::getF(&local_59d8,&local_5a00);
        kj::_::Debug::log<char_const(&)[39],char_const(&)[1],capnp::Text::Builder>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x518,ERROR,
                   "\"failed: expected \" \"(\\\"\\\") == (l[2].getF())\", \"\", l[2].getF()",
                   (char (*) [39])"failed: expected (\"\") == (l[2].getF())",(char (*) [1])0x51fdd1,
                   &local_59d8);
        local_59b9 = false;
      }
    }
    List<capnproto_test::capnp::test::TestLists::StructP,_(capnp::Kind)3>::Builder::operator[]
              ((Builder *)local_5a40,(Builder *)local_5840,3);
    capnproto_test::capnp::test::TestLists::StructP::Builder::getF
              (&local_5a18,(Builder *)local_5a40);
    bVar1 = capnp::operator==("",&local_5a18);
    if (!bVar1) {
      local_5a41 = kj::_::Debug::shouldLog(ERROR);
      while (local_5a41 != false) {
        List<capnproto_test::capnp::test::TestLists::StructP,_(capnp::Kind)3>::Builder::operator[]
                  (&local_5a88,(Builder *)local_5840,3);
        capnproto_test::capnp::test::TestLists::StructP::Builder::getF(&local_5a60,&local_5a88);
        kj::_::Debug::log<char_const(&)[39],char_const(&)[1],capnp::Text::Builder>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x519,ERROR,
                   "\"failed: expected \" \"(\\\"\\\") == (l[3].getF())\", \"\", l[3].getF()",
                   (char (*) [39])"failed: expected (\"\") == (l[3].getF())",(char (*) [1])0x51fdd1,
                   &local_5a60);
        local_5a41 = false;
      }
    }
    List<capnproto_test::capnp::test::TestLists::StructP,_(capnp::Kind)3>::Builder::operator[]
              (&local_5ab0,(Builder *)local_5840,0);
    Text::Reader::Reader((Reader *)&local_5ac0,"foo");
    capnproto_test::capnp::test::TestLists::StructP::Builder::setF(&local_5ab0,(Reader)local_5ac0);
    List<capnproto_test::capnp::test::TestLists::StructP,_(capnp::Kind)3>::Builder::operator[]
              (&local_5ae8,(Builder *)local_5840,1);
    Text::Reader::Reader((Reader *)&local_5af8,"bar");
    capnproto_test::capnp::test::TestLists::StructP::Builder::setF(&local_5ae8,(Reader)local_5af8);
    List<capnproto_test::capnp::test::TestLists::StructP,_(capnp::Kind)3>::Builder::operator[]
              (&local_5b20,(Builder *)local_5840,2);
    Text::Reader::Reader((Reader *)&local_5b30,"baz");
    capnproto_test::capnp::test::TestLists::StructP::Builder::setF(&local_5b20,(Reader)local_5b30);
    List<capnproto_test::capnp::test::TestLists::StructP,_(capnp::Kind)3>::Builder::operator[]
              (&local_5b58,(Builder *)local_5840,3);
    Text::Reader::Reader((Reader *)&local_5b68,"qux");
    capnproto_test::capnp::test::TestLists::StructP::Builder::setF(&local_5b58,(Reader)local_5b68);
    puStack_5cd0 = auStack_128;
    kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__37>
              (&local_5cc8,(kj *)&stack0xffffffffffffa330,func_36);
    bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_5cc8,(void *)0x0);
    kj::Maybe<kj::Exception>::~Maybe(&local_5cc8);
    func_37 = extraout_RDX_56;
    if (!bVar1) {
      local_5cd1 = kj::_::Debug::shouldLog(ERROR);
      func_37 = extraout_RDX_57;
      while (local_5cd1 != false) {
        kj::_::Debug::log<char_const(&)[112]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x51f,ERROR,
                   "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
                   ,(char (*) [112])
                    "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
                  );
        func_37 = extraout_RDX_58;
        local_5cd1 = false;
      }
    }
    puStack_5e40 = auStack_128;
    kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__38>
              (&local_5e38,(kj *)&stack0xffffffffffffa1c0,func_37);
    bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_5e38,(void *)0x0);
    kj::Maybe<kj::Exception>::~Maybe(&local_5e38);
    func_38 = extraout_RDX_59;
    if (!bVar1) {
      local_5e41 = kj::_::Debug::shouldLog(ERROR);
      func_38 = extraout_RDX_60;
      while (local_5e41 != false) {
        kj::_::Debug::log<char_const(&)[116]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x520,ERROR,
                   "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint16_t>>(); }) != nullptr\""
                   ,(char (*) [116])
                    "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint16_t>>(); }) != nullptr"
                  );
        func_38 = extraout_RDX_61;
        local_5e41 = false;
      }
    }
    puStack_5fb0 = auStack_128;
    kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__39>
              (&local_5fa8,(kj *)&stack0xffffffffffffa050,func_38);
    bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_5fa8,(void *)0x0);
    kj::Maybe<kj::Exception>::~Maybe(&local_5fa8);
    func_39 = extraout_RDX_62;
    if (!bVar1) {
      local_5fb1 = kj::_::Debug::shouldLog(ERROR);
      func_39 = extraout_RDX_63;
      while (local_5fb1 != false) {
        kj::_::Debug::log<char_const(&)[116]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x521,ERROR,
                   "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr\""
                   ,(char (*) [116])
                    "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr"
                  );
        func_39 = extraout_RDX_64;
        local_5fb1 = false;
      }
    }
    puStack_6120 = auStack_128;
    kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__40>
              (&local_6118,(kj *)&stack0xffffffffffff9ee0,func_39);
    bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_6118,(void *)0x0);
    kj::Maybe<kj::Exception>::~Maybe(&local_6118);
    if (!bVar1) {
      local_6121 = kj::_::Debug::shouldLog(ERROR);
      while (local_6121 != false) {
        kj::_::Debug::log<char_const(&)[116]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x522,ERROR,
                   "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr\""
                   ,(char (*) [116])
                    "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint64_t>>(); }) != nullptr"
                  );
        local_6121 = false;
      }
    }
    capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
              (&local_6168,(Builder *)auStack_128);
    AnyPointer::Builder::getAs<capnp::List<capnp::Text,(capnp::Kind)1>>(&local_6150,&local_6168);
    Text::Reader::Reader(&local_61b8,"foo");
    Text::Reader::Reader(&local_61a8,"bar");
    Text::Reader::Reader(&local_6198,"baz");
    Text::Reader::Reader(&local_6188,"qux");
    local_6178 = &local_61b8;
    local_6170 = 4;
    expected._M_len = 4;
    expected._M_array = local_6178;
    reader_30.builder.capTable = local_6150.builder.capTable;
    reader_30.builder.segment = local_6150.builder.segment;
    reader_30.builder.ptr = local_6150.builder.ptr;
    reader_30.builder.elementCount = local_6150.builder.elementCount;
    reader_30.builder.step = local_6150.builder.step;
    reader_30.builder.structDataSize = local_6150.builder.structDataSize;
    reader_30.builder.structPointerCount = local_6150.builder.structPointerCount;
    reader_30.builder.elementSize = local_6150.builder.elementSize;
    reader_30.builder._39_1_ = local_6150.builder._39_1_;
    checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Builder,_capnp::List<capnp::Text,_(capnp::Kind)1>,_false>
              (reader_30,expected);
    capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
              (&local_61d0,(Builder *)auStack_128);
    Text::Reader::Reader(&local_6220,"foo");
    Text::Reader::Reader(&local_6210,"bar");
    Text::Reader::Reader(&local_6200,"baz");
    Text::Reader::Reader(&local_61f0,"qux");
    local_61e0 = &local_6220;
    local_61d8 = 4;
    list_00._M_len = 4;
    list_00._M_array = local_61e0;
    AnyPointer::Builder::setAs<capnp::List<capnp::Text,(capnp::Kind)1>>(&local_61d0,list_00);
    puStack_6388 = auStack_128;
    kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__41>
              (&local_6380,(kj *)&stack0xffffffffffff9c78,func_40);
    bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_6380,(void *)0x0);
    kj::Maybe<kj::Exception>::~Maybe(&local_6380);
    if (!bVar1) {
      local_6389 = kj::_::Debug::shouldLog(ERROR);
      while (local_6389 != false) {
        kj::_::Debug::log<char_const(&)[116]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x528,ERROR,
                   "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr\""
                   ,(char (*) [116])
                    "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<uint32_t>>(); }) != nullptr"
                  );
        local_6389 = false;
      }
    }
    capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
              (&local_63a8,(Builder *)auStack_128);
    local_63c8[0] = 0xc;
    local_63c8[1] = 0x22;
    local_63c8[2] = 0x38;
    local_63c8[3] = 0x4e;
    local_63b8 = local_63c8;
    local_63b0 = 4;
    list._M_len = 4;
    list._M_array = local_63b8;
    AnyPointer::Builder::setAs<capnp::List<unsigned_int,(capnp::Kind)0>>(&local_63a8,list);
    puStack_6530 = auStack_128;
    kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1089::run()::__42>
              (&local_6528,(kj *)&stack0xffffffffffff9ad0,func_41);
    bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_6528,(void *)0x0);
    kj::Maybe<kj::Exception>::~Maybe(&local_6528);
    if (!bVar1) {
      local_6531 = kj::_::Debug::shouldLog(ERROR);
      while (local_6531 != false) {
        kj::_::Debug::log<char_const(&)[112]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x52a,ERROR,
                   "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr\""
                   ,(char (*) [112])
                    "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<Text>>(); }) != nullptr"
                  );
        local_6531 = false;
      }
    }
    MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
    return;
  }
  local_51b4 = 4;
  local_51b8 = List<capnproto_test::capnp::test::TestLists::Struct16,_(capnp::Kind)3>::Builder::size
                         ((Builder *)local_5190);
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
            (&local_51b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
             ,0x501,FAILED,"(4u) == (l.size())","4u, l.size()",&local_51b4,&local_51b8);
  kj::_::Debug::Fault::fatal(&local_51b0);
}

Assistant:

TEST(Encoding, UpgradeListInBuilder) {
  // Test every damned list upgrade.

  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestAnyPointer>();

  // -----------------------------------------------------------------

  root.getAnyPointerField().setAs<List<Void>>({VOID, VOID, VOID, VOID});
  checkList(root.getAnyPointerField().getAs<List<Void>>(), {VOID, VOID, VOID, VOID});
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint8_t>>());
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint16_t>>());
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint32_t>>());
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint64_t>>());
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<Text>>());
  checkUpgradedList(root, {0, 0, 0, 0}, {"", "", "", ""});

  // -----------------------------------------------------------------

  {
    root.getAnyPointerField().setAs<List<bool>>({true, false, true, true});
    auto orig = root.asReader().getAnyPointerField().getAs<List<bool>>();
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<Void>>());
    checkList(root.getAnyPointerField().getAs<List<bool>>(), {true, false, true, true});
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint8_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint16_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint32_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint64_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<Text>>());

    checkList(orig, {true, false, true, true});

    // Can't upgrade bit lists. (This used to be supported.)
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<test::TestNewVersion>>());
  }

  // -----------------------------------------------------------------

  {
    root.getAnyPointerField().setAs<List<uint8_t>>({0x12, 0x23, 0x33, 0x44});
    auto orig = root.asReader().getAnyPointerField().getAs<List<uint8_t>>();
    checkList(root.getAnyPointerField().getAs<List<Void>>(), {VOID, VOID, VOID, VOID});
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());
    checkList(root.getAnyPointerField().getAs<List<uint8_t>>(), {0x12, 0x23, 0x33, 0x44});
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint16_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint32_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint64_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<Text>>());

    checkList(orig, {0x12, 0x23, 0x33, 0x44});
    checkUpgradedList(root, {0x12, 0x23, 0x33, 0x44}, {"", "", "", ""});
    checkList(orig, {0, 0, 0, 0});  // old location zero'd during upgrade
  }

  // -----------------------------------------------------------------

  {
    root.getAnyPointerField().setAs<List<uint16_t>>({0x5612, 0x7823, 0xab33, 0xcd44});
    auto orig = root.asReader().getAnyPointerField().getAs<List<uint16_t>>();
    checkList(root.getAnyPointerField().getAs<List<Void>>(), {VOID, VOID, VOID, VOID});
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());
    checkList(root.getAnyPointerField().getAs<List<uint8_t>>(), {0x12, 0x23, 0x33, 0x44});
    checkList(root.getAnyPointerField().getAs<List<uint16_t>>(), {0x5612, 0x7823, 0xab33, 0xcd44});
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint32_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint64_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<Text>>());

    checkList(orig, {0x5612, 0x7823, 0xab33, 0xcd44});
    checkUpgradedList(root, {0x5612, 0x7823, 0xab33, 0xcd44}, {"", "", "", ""});
    checkList(orig, {0, 0, 0, 0});  // old location zero'd during upgrade
  }

  // -----------------------------------------------------------------

  {
    root.getAnyPointerField().setAs<List<uint32_t>>({0x17595612, 0x29347823, 0x5923ab32, 0x1a39cd45});
    auto orig = root.asReader().getAnyPointerField().getAs<List<uint32_t>>();
    checkList(root.getAnyPointerField().getAs<List<Void>>(), {VOID, VOID, VOID, VOID});
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());
    checkList(root.getAnyPointerField().getAs<List<uint8_t>>(), {0x12, 0x23, 0x32, 0x45});
    checkList(root.getAnyPointerField().getAs<List<uint16_t>>(), {0x5612, 0x7823, 0xab32, 0xcd45});
    checkList(root.getAnyPointerField().getAs<List<uint32_t>>(), {0x17595612u, 0x29347823u, 0x5923ab32u, 0x1a39cd45u});
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint64_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<Text>>());

    checkList(orig, {0x17595612u, 0x29347823u, 0x5923ab32u, 0x1a39cd45u});
    checkUpgradedList(root, {0x17595612, 0x29347823, 0x5923ab32, 0x1a39cd45}, {"", "", "", ""});
    checkList(orig, {0u, 0u, 0u, 0u});  // old location zero'd during upgrade
  }

  // -----------------------------------------------------------------

  {
    root.getAnyPointerField().setAs<List<uint64_t>>({0x1234abcd8735fe21, 0x7173bc0e1923af36});
    auto orig = root.asReader().getAnyPointerField().getAs<List<uint64_t>>();
    checkList(root.getAnyPointerField().getAs<List<Void>>(), {VOID, VOID});
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());
    checkList(root.getAnyPointerField().getAs<List<uint8_t>>(), {0x21, 0x36});
    checkList(root.getAnyPointerField().getAs<List<uint16_t>>(), {0xfe21, 0xaf36});
    checkList(root.getAnyPointerField().getAs<List<uint32_t>>(), {0x8735fe21u, 0x1923af36u});
    checkList(root.getAnyPointerField().getAs<List<uint64_t>>(), {0x1234abcd8735fe21ull, 0x7173bc0e1923af36ull});
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<Text>>());

    checkList(orig, {0x1234abcd8735fe21ull, 0x7173bc0e1923af36ull});
    checkUpgradedList(root, {0x1234abcd8735fe21ull, 0x7173bc0e1923af36ull}, {"", ""});
    checkList(orig, {0u, 0u});  // old location zero'd during upgrade
  }

  // -----------------------------------------------------------------

  {
    root.getAnyPointerField().setAs<List<Text>>({"foo", "bar", "baz"});
    auto orig = root.asReader().getAnyPointerField().getAs<List<Text>>();
    checkList(root.getAnyPointerField().getAs<List<Void>>(), {VOID, VOID, VOID});
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint8_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint16_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint32_t>>());
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint64_t>>());
    checkList(root.getAnyPointerField().getAs<List<Text>>(), {"foo", "bar", "baz"});

    checkList(orig, {"foo", "bar", "baz"});
    checkUpgradedList(root, {0, 0, 0}, {"foo", "bar", "baz"});
    checkList(orig, {"", "", ""});  // old location zero'd during upgrade
  }

  // -----------------------------------------------------------------

  {
    {
      auto l = root.getAnyPointerField().initAs<List<test::TestOldVersion>>(3);
      l[0].setOld1(0x1234567890abcdef);
      l[1].setOld1(0x234567890abcdef1);
      l[2].setOld1(0x34567890abcdef12);
      l[0].setOld2("foo");
      l[1].setOld2("bar");
      l[2].setOld2("baz");
    }
    auto orig = root.asReader().getAnyPointerField().getAs<List<test::TestOldVersion>>();

    checkList(root.getAnyPointerField().getAs<List<Void>>(), {VOID, VOID, VOID});
    EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());
    checkList(root.getAnyPointerField().getAs<List<uint8_t>>(), {0xefu, 0xf1u, 0x12u});
    checkList(root.getAnyPointerField().getAs<List<uint16_t>>(), {0xcdefu, 0xdef1u, 0xef12u});
    checkList(root.getAnyPointerField().getAs<List<uint32_t>>(), {0x90abcdefu, 0x0abcdef1u, 0xabcdef12u});
    checkList(root.getAnyPointerField().getAs<List<uint64_t>>(),
              {0x1234567890abcdefull, 0x234567890abcdef1ull, 0x34567890abcdef12ull});
    checkList(root.getAnyPointerField().getAs<List<Text>>(), {"foo", "bar", "baz"});

    checkList(orig, {0x1234567890abcdefull, 0x234567890abcdef1ull, 0x34567890abcdef12ull},
                    {"foo", "bar", "baz"});
    checkUpgradedList(root, {0x1234567890abcdefull, 0x234567890abcdef1ull, 0x34567890abcdef12ull},
                            {"foo", "bar", "baz"});
    checkList(orig, {0u, 0u, 0u}, {"", "", ""});  // old location zero'd during upgrade
  }

  // -----------------------------------------------------------------
  // OK, now we've tested upgrading every primitive list to every primitive list, every primitive
  // list to a multi-word struct, and a multi-word struct to every primitive list.  But we haven't
  // tried upgrading primitive lists to sub-word structs.

  // Upgrade from multi-byte, sub-word data.
  root.getAnyPointerField().setAs<List<uint16_t>>({12u, 34u, 56u, 78u});
  {
    auto orig = root.asReader().getAnyPointerField().getAs<List<uint16_t>>();
    checkList(orig, {12u, 34u, 56u, 78u});
    auto l = root.getAnyPointerField().getAs<List<test::TestLists::Struct32>>();
    checkList(orig, {0u, 0u, 0u, 0u});  // old location zero'd during upgrade
    ASSERT_EQ(4u, l.size());
    EXPECT_EQ(12u, l[0].getF());
    EXPECT_EQ(34u, l[1].getF());
    EXPECT_EQ(56u, l[2].getF());
    EXPECT_EQ(78u, l[3].getF());
    l[0].setF(0x65ac1235u);
    l[1].setF(0x13f12879u);
    l[2].setF(0x33423082u);
    l[3].setF(0x12988948u);
  }
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());
  checkList(root.getAnyPointerField().getAs<List<uint8_t>>(), {0x35u, 0x79u, 0x82u, 0x48u});
  checkList(root.getAnyPointerField().getAs<List<uint16_t>>(), {0x1235u, 0x2879u, 0x3082u, 0x8948u});
  checkList(root.getAnyPointerField().getAs<List<uint32_t>>(),
            {0x65ac1235u, 0x13f12879u, 0x33423082u, 0x12988948u});
  checkList(root.getAnyPointerField().getAs<List<uint64_t>>(),
            {0x65ac1235u, 0x13f12879u, 0x33423082u, 0x12988948u});
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<Text>>());

  // Upgrade from void -> data struct
  root.getAnyPointerField().setAs<List<Void>>({VOID, VOID, VOID, VOID});
  {
    auto l = root.getAnyPointerField().getAs<List<test::TestLists::Struct16>>();
    ASSERT_EQ(4u, l.size());
    EXPECT_EQ(0u, l[0].getF());
    EXPECT_EQ(0u, l[1].getF());
    EXPECT_EQ(0u, l[2].getF());
    EXPECT_EQ(0u, l[3].getF());
    l[0].setF(12573);
    l[1].setF(3251);
    l[2].setF(9238);
    l[3].setF(5832);
  }
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());
  checkList(root.getAnyPointerField().getAs<List<uint16_t>>(), {12573u, 3251u, 9238u, 5832u});
  checkList(root.getAnyPointerField().getAs<List<uint32_t>>(), {12573u, 3251u, 9238u, 5832u});
  checkList(root.getAnyPointerField().getAs<List<uint64_t>>(), {12573u, 3251u, 9238u, 5832u});
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<Text>>());

  // Upgrade from void -> pointer struct
  root.getAnyPointerField().setAs<List<Void>>({VOID, VOID, VOID, VOID});
  {
    auto l = root.getAnyPointerField().getAs<List<test::TestLists::StructP>>();
    ASSERT_EQ(4u, l.size());
    EXPECT_EQ("", l[0].getF());
    EXPECT_EQ("", l[1].getF());
    EXPECT_EQ("", l[2].getF());
    EXPECT_EQ("", l[3].getF());
    l[0].setF("foo");
    l[1].setF("bar");
    l[2].setF("baz");
    l[3].setF("qux");
  }
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint16_t>>());
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint32_t>>());
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint64_t>>());
  checkList(root.getAnyPointerField().getAs<List<Text>>(), {"foo", "bar", "baz", "qux"});

  // Verify that we cannot "side-grade" a pointer list to a data list, or a data list to
  // a pointer struct list.
  root.getAnyPointerField().setAs<List<Text>>({"foo", "bar", "baz", "qux"});
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<uint32_t>>());
  root.getAnyPointerField().setAs<List<uint32_t>>({12, 34, 56, 78});
  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<Text>>());
}